

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  ulong uVar65;
  byte bVar66;
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar74 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar89 [16];
  undefined1 auVar99 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar107 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 extraout_var [56];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float t1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar169;
  undefined1 auVar168 [32];
  float fVar170;
  float fVar188;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar192;
  float fVar210;
  float fVar211;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar206 [32];
  float fVar212;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar216;
  undefined1 auVar209 [32];
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar230;
  float fVar231;
  float fVar233;
  float fVar235;
  float fVar236;
  undefined1 auVar227 [32];
  float fVar232;
  undefined1 auVar228 [32];
  undefined1 auVar234 [16];
  vfloat4 b0;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar252;
  float fVar253;
  float fVar259;
  float fVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar258 [32];
  float fVar264;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar276;
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar278;
  undefined1 auVar275 [32];
  __m128 a;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  vfloat4 a0;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar301 [32];
  undefined1 auVar300 [32];
  undefined1 auVar302 [64];
  float fVar303;
  float fVar309;
  float fVar310;
  vfloat4 a0_1;
  undefined1 auVar304 [16];
  float fVar311;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar312;
  float fVar313;
  float fVar314;
  float in_register_0000151c;
  undefined1 auVar307 [32];
  float fVar315;
  undefined1 auVar308 [64];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  float fVar321;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float in_register_0000159c;
  undefined1 auVar328 [32];
  float fVar333;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  undefined1 local_4a8 [16];
  undefined1 (*local_490) [16];
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  RTCFilterFunctionNArguments local_468;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 auStack_3c8 [16];
  uint auStack_3b8 [4];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  float afStack_228 [8];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar229 [32];
  undefined1 auVar329 [32];
  
  PVar7 = prim[1];
  uVar71 = (ulong)(byte)PVar7;
  lVar70 = uVar71 * 5;
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar221 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar221 = vinsertps_avx(auVar221,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar192 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar78 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar103._0_4_ = fVar192 * auVar78._0_4_;
  auVar103._4_4_ = fVar192 * auVar78._4_4_;
  auVar103._8_4_ = fVar192 * auVar78._8_4_;
  auVar103._12_4_ = fVar192 * auVar78._12_4_;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 10)));
  auVar193._0_4_ = fVar192 * auVar221._0_4_;
  auVar193._4_4_ = fVar192 * auVar221._4_4_;
  auVar193._8_4_ = fVar192 * auVar221._8_4_;
  auVar193._12_4_ = fVar192 * auVar221._12_4_;
  auVar90._16_16_ = auVar153;
  auVar90._0_16_ = auVar78;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar70 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar70 + 10)));
  auVar154._16_16_ = auVar221;
  auVar154._0_16_ = auVar78;
  auVar14 = vcvtdq2ps_avx(auVar154);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 10)));
  auVar164._16_16_ = auVar221;
  auVar164._0_16_ = auVar78;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 10)));
  auVar15 = vcvtdq2ps_avx(auVar164);
  auVar165._16_16_ = auVar221;
  auVar165._0_16_ = auVar78;
  auVar16 = vcvtdq2ps_avx(auVar165);
  uVar69 = (ulong)((uint)(byte)PVar7 * 0xc);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 10)));
  auVar227._16_16_ = auVar221;
  auVar227._0_16_ = auVar78;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar71 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar227);
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar71 + 10)));
  auVar245._16_16_ = auVar221;
  auVar245._0_16_ = auVar78;
  lVar13 = uVar71 * 9;
  uVar69 = (ulong)(uint)((int)lVar13 * 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar245);
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 10)));
  auVar246._16_16_ = auVar221;
  auVar246._0_16_ = auVar78;
  auVar19 = vcvtdq2ps_avx(auVar246);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar71 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + uVar71 + 10)));
  auVar273._16_16_ = auVar221;
  auVar273._0_16_ = auVar78;
  uVar69 = (ulong)(uint)((int)lVar70 << 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 10)));
  auVar20 = vcvtdq2ps_avx(auVar273);
  auVar287._16_16_ = auVar221;
  auVar287._0_16_ = auVar78;
  auVar21 = vcvtdq2ps_avx(auVar287);
  auVar78 = vshufps_avx(auVar193,auVar193,0);
  auVar221 = vshufps_avx(auVar193,auVar193,0x55);
  auVar153 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar192 = auVar153._0_4_;
  fVar217 = auVar153._4_4_;
  fVar210 = auVar153._8_4_;
  fVar230 = auVar153._12_4_;
  fVar211 = auVar221._0_4_;
  fVar231 = auVar221._4_4_;
  fVar212 = auVar221._8_4_;
  fVar232 = auVar221._12_4_;
  fVar213 = auVar78._0_4_;
  fVar233 = auVar78._4_4_;
  fVar214 = auVar78._8_4_;
  fVar235 = auVar78._12_4_;
  auVar307._0_4_ = fVar213 * auVar90._0_4_ + fVar211 * auVar14._0_4_ + fVar192 * auVar15._0_4_;
  auVar307._4_4_ = fVar233 * auVar90._4_4_ + fVar231 * auVar14._4_4_ + fVar217 * auVar15._4_4_;
  auVar307._8_4_ = fVar214 * auVar90._8_4_ + fVar212 * auVar14._8_4_ + fVar210 * auVar15._8_4_;
  auVar307._12_4_ = fVar235 * auVar90._12_4_ + fVar232 * auVar14._12_4_ + fVar230 * auVar15._12_4_;
  auVar307._16_4_ = fVar213 * auVar90._16_4_ + fVar211 * auVar14._16_4_ + fVar192 * auVar15._16_4_;
  auVar307._20_4_ = fVar233 * auVar90._20_4_ + fVar231 * auVar14._20_4_ + fVar217 * auVar15._20_4_;
  auVar307._24_4_ = fVar214 * auVar90._24_4_ + fVar212 * auVar14._24_4_ + fVar210 * auVar15._24_4_;
  auVar307._28_4_ = fVar232 + in_register_000015dc + in_register_0000151c;
  auVar299._0_4_ = fVar213 * auVar16._0_4_ + fVar211 * auVar17._0_4_ + auVar18._0_4_ * fVar192;
  auVar299._4_4_ = fVar233 * auVar16._4_4_ + fVar231 * auVar17._4_4_ + auVar18._4_4_ * fVar217;
  auVar299._8_4_ = fVar214 * auVar16._8_4_ + fVar212 * auVar17._8_4_ + auVar18._8_4_ * fVar210;
  auVar299._12_4_ = fVar235 * auVar16._12_4_ + fVar232 * auVar17._12_4_ + auVar18._12_4_ * fVar230;
  auVar299._16_4_ = fVar213 * auVar16._16_4_ + fVar211 * auVar17._16_4_ + auVar18._16_4_ * fVar192;
  auVar299._20_4_ = fVar233 * auVar16._20_4_ + fVar231 * auVar17._20_4_ + auVar18._20_4_ * fVar217;
  auVar299._24_4_ = fVar214 * auVar16._24_4_ + fVar212 * auVar17._24_4_ + auVar18._24_4_ * fVar210;
  auVar299._28_4_ = fVar232 + in_register_000015dc + in_register_0000159c;
  auVar206._0_4_ = fVar213 * auVar19._0_4_ + fVar211 * auVar20._0_4_ + auVar21._0_4_ * fVar192;
  auVar206._4_4_ = fVar233 * auVar19._4_4_ + fVar231 * auVar20._4_4_ + auVar21._4_4_ * fVar217;
  auVar206._8_4_ = fVar214 * auVar19._8_4_ + fVar212 * auVar20._8_4_ + auVar21._8_4_ * fVar210;
  auVar206._12_4_ = fVar235 * auVar19._12_4_ + fVar232 * auVar20._12_4_ + auVar21._12_4_ * fVar230;
  auVar206._16_4_ = fVar213 * auVar19._16_4_ + fVar211 * auVar20._16_4_ + auVar21._16_4_ * fVar192;
  auVar206._20_4_ = fVar233 * auVar19._20_4_ + fVar231 * auVar20._20_4_ + auVar21._20_4_ * fVar217;
  auVar206._24_4_ = fVar214 * auVar19._24_4_ + fVar212 * auVar20._24_4_ + auVar21._24_4_ * fVar210;
  auVar206._28_4_ = fVar235 + fVar232 + fVar230;
  auVar78 = vshufps_avx(auVar103,auVar103,0);
  auVar221 = vshufps_avx(auVar103,auVar103,0x55);
  auVar153 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar217 = auVar153._0_4_;
  fVar210 = auVar153._4_4_;
  fVar230 = auVar153._8_4_;
  fVar211 = auVar153._12_4_;
  fVar233 = auVar221._0_4_;
  fVar214 = auVar221._4_4_;
  fVar235 = auVar221._8_4_;
  fVar215 = auVar221._12_4_;
  fVar231 = auVar78._0_4_;
  fVar212 = auVar78._4_4_;
  fVar232 = auVar78._8_4_;
  fVar213 = auVar78._12_4_;
  fVar192 = auVar90._28_4_;
  auVar125._0_4_ = fVar231 * auVar90._0_4_ + fVar233 * auVar14._0_4_ + fVar217 * auVar15._0_4_;
  auVar125._4_4_ = fVar212 * auVar90._4_4_ + fVar214 * auVar14._4_4_ + fVar210 * auVar15._4_4_;
  auVar125._8_4_ = fVar232 * auVar90._8_4_ + fVar235 * auVar14._8_4_ + fVar230 * auVar15._8_4_;
  auVar125._12_4_ = fVar213 * auVar90._12_4_ + fVar215 * auVar14._12_4_ + fVar211 * auVar15._12_4_;
  auVar125._16_4_ = fVar231 * auVar90._16_4_ + fVar233 * auVar14._16_4_ + fVar217 * auVar15._16_4_;
  auVar125._20_4_ = fVar212 * auVar90._20_4_ + fVar214 * auVar14._20_4_ + fVar210 * auVar15._20_4_;
  auVar125._24_4_ = fVar232 * auVar90._24_4_ + fVar235 * auVar14._24_4_ + fVar230 * auVar15._24_4_;
  auVar125._28_4_ = fVar192 + auVar14._28_4_ + auVar15._28_4_;
  auVar155._0_4_ = fVar231 * auVar16._0_4_ + auVar18._0_4_ * fVar217 + fVar233 * auVar17._0_4_;
  auVar155._4_4_ = fVar212 * auVar16._4_4_ + auVar18._4_4_ * fVar210 + fVar214 * auVar17._4_4_;
  auVar155._8_4_ = fVar232 * auVar16._8_4_ + auVar18._8_4_ * fVar230 + fVar235 * auVar17._8_4_;
  auVar155._12_4_ = fVar213 * auVar16._12_4_ + auVar18._12_4_ * fVar211 + fVar215 * auVar17._12_4_;
  auVar155._16_4_ = fVar231 * auVar16._16_4_ + auVar18._16_4_ * fVar217 + fVar233 * auVar17._16_4_;
  auVar155._20_4_ = fVar212 * auVar16._20_4_ + auVar18._20_4_ * fVar210 + fVar214 * auVar17._20_4_;
  auVar155._24_4_ = fVar232 * auVar16._24_4_ + auVar18._24_4_ * fVar230 + fVar235 * auVar17._24_4_;
  auVar155._28_4_ = fVar192 + auVar18._28_4_ + auVar15._28_4_;
  auVar166._8_4_ = 0x7fffffff;
  auVar166._0_8_ = 0x7fffffff7fffffff;
  auVar166._12_4_ = 0x7fffffff;
  auVar166._16_4_ = 0x7fffffff;
  auVar166._20_4_ = 0x7fffffff;
  auVar166._24_4_ = 0x7fffffff;
  auVar166._28_4_ = 0x7fffffff;
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar183._16_4_ = 0x219392ef;
  auVar183._20_4_ = 0x219392ef;
  auVar183._24_4_ = 0x219392ef;
  auVar183._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(auVar307,auVar166);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar14 = vblendvps_avx(auVar307,auVar183,auVar90);
  auVar90 = vandps_avx(auVar299,auVar166);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar15 = vblendvps_avx(auVar299,auVar183,auVar90);
  auVar90 = vandps_avx(auVar206,auVar166);
  auVar90 = vcmpps_avx(auVar90,auVar183,1);
  auVar90 = vblendvps_avx(auVar206,auVar183,auVar90);
  auVar167._0_4_ = fVar231 * auVar19._0_4_ + fVar233 * auVar20._0_4_ + auVar21._0_4_ * fVar217;
  auVar167._4_4_ = fVar212 * auVar19._4_4_ + fVar214 * auVar20._4_4_ + auVar21._4_4_ * fVar210;
  auVar167._8_4_ = fVar232 * auVar19._8_4_ + fVar235 * auVar20._8_4_ + auVar21._8_4_ * fVar230;
  auVar167._12_4_ = fVar213 * auVar19._12_4_ + fVar215 * auVar20._12_4_ + auVar21._12_4_ * fVar211;
  auVar167._16_4_ = fVar231 * auVar19._16_4_ + fVar233 * auVar20._16_4_ + auVar21._16_4_ * fVar217;
  auVar167._20_4_ = fVar212 * auVar19._20_4_ + fVar214 * auVar20._20_4_ + auVar21._20_4_ * fVar210;
  auVar167._24_4_ = fVar232 * auVar19._24_4_ + fVar235 * auVar20._24_4_ + auVar21._24_4_ * fVar230;
  auVar167._28_4_ = fVar192 + auVar17._28_4_ + fVar211;
  auVar16 = vrcpps_avx(auVar14);
  fVar192 = auVar16._0_4_;
  fVar210 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar210;
  auVar17._0_4_ = auVar14._0_4_ * fVar192;
  fVar211 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar211;
  fVar212 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar212;
  fVar213 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar213;
  fVar214 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar214;
  fVar215 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar215;
  auVar17._28_4_ = auVar206._28_4_;
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar247._16_4_ = 0x3f800000;
  auVar247._20_4_ = 0x3f800000;
  auVar247._24_4_ = 0x3f800000;
  auVar247._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar247,auVar17);
  auVar14 = vrcpps_avx(auVar15);
  fVar192 = fVar192 + fVar192 * auVar17._0_4_;
  fVar210 = fVar210 + fVar210 * auVar17._4_4_;
  fVar211 = fVar211 + fVar211 * auVar17._8_4_;
  fVar212 = fVar212 + fVar212 * auVar17._12_4_;
  fVar213 = fVar213 + fVar213 * auVar17._16_4_;
  fVar214 = fVar214 + fVar214 * auVar17._20_4_;
  fVar215 = fVar215 + fVar215 * auVar17._24_4_;
  fVar217 = auVar14._0_4_;
  fVar230 = auVar14._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar230;
  auVar18._0_4_ = auVar15._0_4_ * fVar217;
  fVar231 = auVar14._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar231;
  fVar232 = auVar14._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar232;
  fVar233 = auVar14._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar233;
  fVar235 = auVar14._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar235;
  fVar236 = auVar14._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar236;
  auVar18._28_4_ = auVar16._28_4_;
  auVar14 = vsubps_avx(auVar247,auVar18);
  fVar217 = fVar217 + fVar217 * auVar14._0_4_;
  fVar230 = fVar230 + fVar230 * auVar14._4_4_;
  fVar231 = fVar231 + fVar231 * auVar14._8_4_;
  fVar232 = fVar232 + fVar232 * auVar14._12_4_;
  fVar233 = fVar233 + fVar233 * auVar14._16_4_;
  fVar235 = fVar235 + fVar235 * auVar14._20_4_;
  fVar236 = fVar236 + fVar236 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar90);
  fVar170 = auVar14._0_4_;
  fVar186 = auVar14._4_4_;
  auVar15._4_4_ = fVar186 * auVar90._4_4_;
  auVar15._0_4_ = fVar170 * auVar90._0_4_;
  fVar187 = auVar14._8_4_;
  auVar15._8_4_ = fVar187 * auVar90._8_4_;
  fVar188 = auVar14._12_4_;
  auVar15._12_4_ = fVar188 * auVar90._12_4_;
  fVar189 = auVar14._16_4_;
  auVar15._16_4_ = fVar189 * auVar90._16_4_;
  fVar190 = auVar14._20_4_;
  auVar15._20_4_ = fVar190 * auVar90._20_4_;
  fVar191 = auVar14._24_4_;
  auVar15._24_4_ = fVar191 * auVar90._24_4_;
  auVar15._28_4_ = auVar90._28_4_;
  auVar90 = vsubps_avx(auVar247,auVar15);
  fVar170 = fVar170 + fVar170 * auVar90._0_4_;
  fVar186 = fVar186 + fVar186 * auVar90._4_4_;
  fVar187 = fVar187 + fVar187 * auVar90._8_4_;
  fVar188 = fVar188 + fVar188 * auVar90._12_4_;
  fVar189 = fVar189 + fVar189 * auVar90._16_4_;
  fVar190 = fVar190 + fVar190 * auVar90._20_4_;
  fVar191 = fVar191 + fVar191 * auVar90._24_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar71 * 7 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar221);
  auVar91._16_16_ = auVar221;
  auVar91._0_16_ = auVar78;
  auVar90 = vcvtdq2ps_avx(auVar91);
  auVar90 = vsubps_avx(auVar90,auVar125);
  auVar72._0_4_ = fVar192 * auVar90._0_4_;
  auVar72._4_4_ = fVar210 * auVar90._4_4_;
  auVar72._8_4_ = fVar211 * auVar90._8_4_;
  auVar72._12_4_ = fVar212 * auVar90._12_4_;
  auVar16._16_4_ = fVar213 * auVar90._16_4_;
  auVar16._0_16_ = auVar72;
  auVar16._20_4_ = fVar214 * auVar90._20_4_;
  auVar16._24_4_ = fVar215 * auVar90._24_4_;
  auVar16._28_4_ = auVar90._28_4_;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *(ulong *)(prim + lVar13 + 6);
  auVar78 = vpmovsxwd_avx(auVar153);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar13 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar4);
  auVar248._16_16_ = auVar221;
  auVar248._0_16_ = auVar78;
  auVar90 = vcvtdq2ps_avx(auVar248);
  auVar90 = vsubps_avx(auVar90,auVar125);
  auVar104._0_4_ = fVar192 * auVar90._0_4_;
  auVar104._4_4_ = fVar210 * auVar90._4_4_;
  auVar104._8_4_ = fVar211 * auVar90._8_4_;
  auVar104._12_4_ = fVar212 * auVar90._12_4_;
  auVar19._16_4_ = fVar213 * auVar90._16_4_;
  auVar19._0_16_ = auVar104;
  auVar19._20_4_ = fVar214 * auVar90._20_4_;
  auVar19._24_4_ = fVar215 * auVar90._24_4_;
  auVar19._28_4_ = auVar90._28_4_;
  lVar70 = (ulong)(byte)PVar7 * 0x10;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *(ulong *)(prim + lVar70 + 6);
  auVar78 = vpmovsxwd_avx(auVar293);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar70 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar5);
  lVar70 = lVar70 + uVar71 * -2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar70 + 6);
  auVar153 = vpmovsxwd_avx(auVar6);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + lVar70 + 0xe);
  auVar4 = vpmovsxwd_avx(auVar121);
  auVar207._16_16_ = auVar4;
  auVar207._0_16_ = auVar153;
  auVar90 = vcvtdq2ps_avx(auVar207);
  auVar90 = vsubps_avx(auVar90,auVar155);
  auVar194._0_4_ = fVar217 * auVar90._0_4_;
  auVar194._4_4_ = fVar230 * auVar90._4_4_;
  auVar194._8_4_ = fVar231 * auVar90._8_4_;
  auVar194._12_4_ = fVar232 * auVar90._12_4_;
  auVar20._16_4_ = fVar233 * auVar90._16_4_;
  auVar20._0_16_ = auVar194;
  auVar20._20_4_ = fVar235 * auVar90._20_4_;
  auVar20._24_4_ = fVar236 * auVar90._24_4_;
  auVar20._28_4_ = auVar90._28_4_;
  auVar249._16_16_ = auVar221;
  auVar249._0_16_ = auVar78;
  auVar90 = vcvtdq2ps_avx(auVar249);
  auVar90 = vsubps_avx(auVar90,auVar155);
  auVar133._0_4_ = fVar217 * auVar90._0_4_;
  auVar133._4_4_ = fVar230 * auVar90._4_4_;
  auVar133._8_4_ = fVar231 * auVar90._8_4_;
  auVar133._12_4_ = fVar232 * auVar90._12_4_;
  auVar21._16_4_ = fVar233 * auVar90._16_4_;
  auVar21._0_16_ = auVar133;
  auVar21._20_4_ = fVar235 * auVar90._20_4_;
  auVar21._24_4_ = fVar236 * auVar90._24_4_;
  auVar21._28_4_ = auVar90._28_4_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar69 + uVar71 + 6);
  auVar78 = vpmovsxwd_avx(auVar109);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar69 + uVar71 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar139);
  auVar228._16_16_ = auVar221;
  auVar228._0_16_ = auVar78;
  auVar90 = vcvtdq2ps_avx(auVar228);
  auVar90 = vsubps_avx(auVar90,auVar167);
  auVar218._0_4_ = fVar170 * auVar90._0_4_;
  auVar218._4_4_ = fVar186 * auVar90._4_4_;
  auVar218._8_4_ = fVar187 * auVar90._8_4_;
  auVar218._12_4_ = fVar188 * auVar90._12_4_;
  auVar22._16_4_ = fVar189 * auVar90._16_4_;
  auVar22._0_16_ = auVar218;
  auVar22._20_4_ = fVar190 * auVar90._20_4_;
  auVar22._24_4_ = fVar191 * auVar90._24_4_;
  auVar22._28_4_ = auVar90._28_4_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar78 = vpmovsxwd_avx(auVar110);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar234);
  auVar250._16_16_ = auVar221;
  auVar250._0_16_ = auVar78;
  auVar90 = vcvtdq2ps_avx(auVar250);
  auVar90 = vsubps_avx(auVar90,auVar167);
  auVar159._0_4_ = fVar170 * auVar90._0_4_;
  auVar159._4_4_ = fVar186 * auVar90._4_4_;
  auVar159._8_4_ = fVar187 * auVar90._8_4_;
  auVar159._12_4_ = fVar188 * auVar90._12_4_;
  auVar23._16_4_ = fVar189 * auVar90._16_4_;
  auVar23._0_16_ = auVar159;
  auVar23._20_4_ = fVar190 * auVar90._20_4_;
  auVar23._24_4_ = fVar191 * auVar90._24_4_;
  auVar23._28_4_ = auVar90._28_4_;
  auVar78 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar221 = vpminsd_avx(auVar72,auVar104);
  auVar288._16_16_ = auVar78;
  auVar288._0_16_ = auVar221;
  auVar78 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar221 = vpminsd_avx(auVar194,auVar133);
  auVar300._16_16_ = auVar78;
  auVar300._0_16_ = auVar221;
  auVar90 = vmaxps_avx(auVar288,auVar300);
  auVar78 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar221 = vpminsd_avx(auVar218,auVar159);
  auVar320._16_16_ = auVar78;
  auVar320._0_16_ = auVar221;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar328._4_4_ = uVar2;
  auVar328._0_4_ = uVar2;
  auVar328._8_4_ = uVar2;
  auVar328._12_4_ = uVar2;
  auVar328._16_4_ = uVar2;
  auVar328._20_4_ = uVar2;
  auVar328._24_4_ = uVar2;
  auVar328._28_4_ = uVar2;
  auVar14 = vmaxps_avx(auVar320,auVar328);
  auVar90 = vmaxps_avx(auVar90,auVar14);
  local_178._4_4_ = auVar90._4_4_ * 0.99999964;
  local_178._0_4_ = auVar90._0_4_ * 0.99999964;
  local_178._8_4_ = auVar90._8_4_ * 0.99999964;
  local_178._12_4_ = auVar90._12_4_ * 0.99999964;
  local_178._16_4_ = auVar90._16_4_ * 0.99999964;
  local_178._20_4_ = auVar90._20_4_ * 0.99999964;
  local_178._24_4_ = auVar90._24_4_ * 0.99999964;
  local_178._28_4_ = auVar90._28_4_;
  auVar78 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar221 = vpmaxsd_avx(auVar72,auVar104);
  auVar92._16_16_ = auVar78;
  auVar92._0_16_ = auVar221;
  auVar78 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar221 = vpmaxsd_avx(auVar194,auVar133);
  auVar126._16_16_ = auVar78;
  auVar126._0_16_ = auVar221;
  auVar90 = vminps_avx(auVar92,auVar126);
  auVar78 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar221 = vpmaxsd_avx(auVar218,auVar159);
  auVar127._16_16_ = auVar78;
  auVar127._0_16_ = auVar221;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar156._4_4_ = uVar2;
  auVar156._0_4_ = uVar2;
  auVar156._8_4_ = uVar2;
  auVar156._12_4_ = uVar2;
  auVar156._16_4_ = uVar2;
  auVar156._20_4_ = uVar2;
  auVar156._24_4_ = uVar2;
  auVar156._28_4_ = uVar2;
  auVar14 = vminps_avx(auVar127,auVar156);
  auVar90 = vminps_avx(auVar90,auVar14);
  auVar14._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar90._28_4_;
  auVar90 = vcmpps_avx(local_178,auVar14,2);
  auVar78 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar128._16_16_ = auVar78;
  auVar128._0_16_ = auVar78;
  auVar14 = vcvtdq2ps_avx(auVar128);
  auVar14 = vcmpps_avx(_DAT_01faff40,auVar14,1);
  auVar90 = vandps_avx(auVar90,auVar14);
  uVar64 = vmovmskps_avx(auVar90);
  if (uVar64 == 0) {
    return;
  }
  uVar64 = uVar64 & 0xff;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  local_490 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  do {
    uVar71 = (ulong)uVar64;
    lVar70 = 0;
    if (uVar71 != 0) {
      for (; (uVar64 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
      }
    }
    uVar64 = *(uint *)(prim + 2);
    uVar8 = *(uint *)(prim + lVar70 * 4 + 6);
    pGVar9 = (context->scene->geometries).items[uVar64].ptr;
    uVar69 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)uVar8);
    p_Var10 = pGVar9[1].intersectionFilterN;
    pvVar11 = pGVar9[2].userPtr;
    _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar78 = *(undefined1 (*) [16])(_Var12 + uVar69 * (long)pvVar11);
    pfVar1 = (float *)(_Var12 + (uVar69 + 1) * (long)pvVar11);
    fVar192 = *pfVar1;
    fVar217 = pfVar1[1];
    fVar210 = pfVar1[2];
    fVar230 = pfVar1[3];
    pfVar1 = (float *)(_Var12 + (uVar69 + 2) * (long)pvVar11);
    fVar211 = *pfVar1;
    fVar231 = pfVar1[1];
    fVar212 = pfVar1[2];
    fVar232 = pfVar1[3];
    pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar69 + 3));
    fVar213 = *pfVar1;
    fVar233 = pfVar1[1];
    fVar214 = pfVar1[2];
    fVar235 = pfVar1[3];
    uVar71 = uVar71 - 1 & uVar71;
    lVar70 = *(long *)&pGVar9[1].time_range.upper;
    pfVar1 = (float *)(lVar70 + (long)p_Var10 * uVar69);
    fVar215 = *pfVar1;
    fVar236 = pfVar1[1];
    fVar170 = pfVar1[2];
    fVar186 = pfVar1[3];
    pfVar1 = (float *)(lVar70 + (long)p_Var10 * (uVar69 + 1));
    fVar187 = *pfVar1;
    fVar188 = pfVar1[1];
    fVar189 = pfVar1[2];
    fVar190 = pfVar1[3];
    pfVar1 = (float *)(lVar70 + (long)p_Var10 * (uVar69 + 2));
    fVar191 = *pfVar1;
    fVar100 = pfVar1[1];
    fVar101 = pfVar1[2];
    fVar102 = pfVar1[3];
    lVar13 = 0;
    if (uVar71 != 0) {
      for (; (uVar71 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
      }
    }
    pfVar1 = (float *)(lVar70 + (long)p_Var10 * (uVar69 + 3));
    fVar169 = *pfVar1;
    fVar216 = pfVar1[1];
    fVar252 = pfVar1[2];
    fVar253 = pfVar1[3];
    if (((uVar71 != 0) && (uVar69 = uVar71 - 1 & uVar71, uVar69 != 0)) && (lVar70 = 0, uVar69 != 0))
    {
      for (; (uVar69 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
      }
    }
    auVar221 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar153 = vinsertps_avx(auVar221,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_5c8._0_4_ =
         fVar215 * 0.16666667 + fVar187 * 0.6666667 + fVar191 * 0.16666667 + fVar169 * 0.0;
    local_5c8._4_4_ =
         fVar236 * 0.16666667 + fVar188 * 0.6666667 + fVar100 * 0.16666667 + fVar216 * 0.0;
    fStack_5c0 = fVar170 * 0.16666667 + fVar189 * 0.6666667 + fVar101 * 0.16666667 + fVar252 * 0.0;
    fStack_5bc = fVar186 * 0.16666667 + fVar190 * 0.6666667 + fVar102 * 0.16666667 + fVar253 * 0.0;
    auVar134._0_4_ = fVar191 * 0.5 + fVar169 * 0.0;
    auVar134._4_4_ = fVar100 * 0.5 + fVar216 * 0.0;
    auVar134._8_4_ = fVar101 * 0.5 + fVar252 * 0.0;
    auVar134._12_4_ = fVar102 * 0.5 + fVar253 * 0.0;
    auVar290._0_4_ = fVar187 * 0.0;
    auVar290._4_4_ = fVar188 * 0.0;
    auVar290._8_4_ = fVar189 * 0.0;
    auVar290._12_4_ = fVar190 * 0.0;
    auVar221 = vsubps_avx(auVar134,auVar290);
    auVar291._0_4_ = fVar215 * 0.5;
    auVar291._4_4_ = fVar236 * 0.5;
    auVar291._8_4_ = fVar170 * 0.5;
    auVar291._12_4_ = fVar186 * 0.5;
    auVar109 = vsubps_avx(auVar221,auVar291);
    fVar259 = auVar78._0_4_;
    fVar260 = auVar78._4_4_;
    fVar303 = auVar78._8_4_;
    fVar261 = auVar78._12_4_;
    auVar292._0_4_ =
         fVar259 * 0.16666667 + fVar192 * 0.6666667 + fVar211 * 0.16666667 + fVar213 * 0.0;
    auVar292._4_4_ =
         fVar260 * 0.16666667 + fVar217 * 0.6666667 + fVar231 * 0.16666667 + fVar233 * 0.0;
    auVar292._8_4_ =
         fVar303 * 0.16666667 + fVar210 * 0.6666667 + fVar212 * 0.16666667 + fVar214 * 0.0;
    auVar292._12_4_ =
         fVar261 * 0.16666667 + fVar230 * 0.6666667 + fVar232 * 0.16666667 + fVar235 * 0.0;
    auVar304._0_4_ = fVar211 * 0.5 + fVar213 * 0.0;
    auVar304._4_4_ = fVar231 * 0.5 + fVar233 * 0.0;
    auVar304._8_4_ = fVar212 * 0.5 + fVar214 * 0.0;
    auVar304._12_4_ = fVar232 * 0.5 + fVar235 * 0.0;
    auVar316._0_4_ = fVar192 * 0.0;
    auVar316._4_4_ = fVar217 * 0.0;
    auVar316._8_4_ = fVar210 * 0.0;
    auVar316._12_4_ = fVar230 * 0.0;
    auVar78 = vsubps_avx(auVar304,auVar316);
    auVar317._0_4_ = fVar259 * 0.5;
    auVar317._4_4_ = fVar260 * 0.5;
    auVar317._8_4_ = fVar303 * 0.5;
    auVar317._12_4_ = fVar261 * 0.5;
    auVar293 = vsubps_avx(auVar78,auVar317);
    auVar322._0_4_ = fVar215 * 0.0;
    auVar322._4_4_ = fVar236 * 0.0;
    auVar322._8_4_ = fVar170 * 0.0;
    auVar322._12_4_ = fVar186 * 0.0;
    local_5d8._0_4_ =
         auVar322._0_4_ + fVar187 * 0.16666667 + fVar191 * 0.6666667 + fVar169 * 0.16666667;
    local_5d8._4_4_ =
         auVar322._4_4_ + fVar188 * 0.16666667 + fVar100 * 0.6666667 + fVar216 * 0.16666667;
    fStack_5d0 = auVar322._8_4_ + fVar189 * 0.16666667 + fVar101 * 0.6666667 + fVar252 * 0.16666667;
    fStack_5cc = auVar322._12_4_ + fVar190 * 0.16666667 + fVar102 * 0.6666667 + fVar253 * 0.16666667
    ;
    auVar265._0_4_ = fVar191 * 0.0 + fVar169 * 0.5;
    auVar265._4_4_ = fVar100 * 0.0 + fVar216 * 0.5;
    auVar265._8_4_ = fVar101 * 0.0 + fVar252 * 0.5;
    auVar265._12_4_ = fVar102 * 0.0 + fVar253 * 0.5;
    auVar171._0_4_ = fVar187 * 0.5;
    auVar171._4_4_ = fVar188 * 0.5;
    auVar171._8_4_ = fVar189 * 0.5;
    auVar171._12_4_ = fVar190 * 0.5;
    auVar78 = vsubps_avx(auVar265,auVar171);
    auVar139 = vsubps_avx(auVar78,auVar322);
    auVar219._0_4_ = fVar259 * 0.0;
    auVar219._4_4_ = fVar260 * 0.0;
    auVar219._8_4_ = fVar303 * 0.0;
    auVar219._12_4_ = fVar261 * 0.0;
    auVar266._0_4_ =
         fVar192 * 0.16666667 + fVar211 * 0.6666667 + fVar213 * 0.16666667 + auVar219._0_4_;
    auVar266._4_4_ =
         fVar217 * 0.16666667 + fVar231 * 0.6666667 + fVar233 * 0.16666667 + auVar219._4_4_;
    auVar266._8_4_ =
         fVar210 * 0.16666667 + fVar212 * 0.6666667 + fVar214 * 0.16666667 + auVar219._8_4_;
    auVar266._12_4_ =
         fVar230 * 0.16666667 + fVar232 * 0.6666667 + fVar235 * 0.16666667 + auVar219._12_4_;
    auVar237._0_4_ = fVar213 * 0.5 + fVar211 * 0.0;
    auVar237._4_4_ = fVar233 * 0.5 + fVar231 * 0.0;
    auVar237._8_4_ = fVar214 * 0.5 + fVar212 * 0.0;
    auVar237._12_4_ = fVar235 * 0.5 + fVar232 * 0.0;
    auVar195._0_4_ = fVar192 * 0.5;
    auVar195._4_4_ = fVar217 * 0.5;
    auVar195._8_4_ = fVar210 * 0.5;
    auVar195._12_4_ = fVar230 * 0.5;
    auVar78 = vsubps_avx(auVar237,auVar195);
    auVar6 = vsubps_avx(auVar78,auVar219);
    auVar78 = vshufps_avx(auVar109,auVar109,0xc9);
    auVar221 = vshufps_avx(auVar292,auVar292,0xc9);
    fVar169 = auVar109._0_4_;
    auVar238._0_4_ = fVar169 * auVar221._0_4_;
    fVar216 = auVar109._4_4_;
    auVar238._4_4_ = fVar216 * auVar221._4_4_;
    fVar252 = auVar109._8_4_;
    auVar238._8_4_ = fVar252 * auVar221._8_4_;
    fVar253 = auVar109._12_4_;
    auVar238._12_4_ = fVar253 * auVar221._12_4_;
    auVar254._0_4_ = auVar292._0_4_ * auVar78._0_4_;
    auVar254._4_4_ = auVar292._4_4_ * auVar78._4_4_;
    auVar254._8_4_ = auVar292._8_4_ * auVar78._8_4_;
    auVar254._12_4_ = auVar292._12_4_ * auVar78._12_4_;
    auVar221 = vsubps_avx(auVar254,auVar238);
    auVar4 = vshufps_avx(auVar221,auVar221,0xc9);
    auVar221 = vshufps_avx(auVar293,auVar293,0xc9);
    auVar239._0_4_ = fVar169 * auVar221._0_4_;
    auVar239._4_4_ = fVar216 * auVar221._4_4_;
    auVar239._8_4_ = fVar252 * auVar221._8_4_;
    auVar239._12_4_ = fVar253 * auVar221._12_4_;
    auVar196._0_4_ = auVar293._0_4_ * auVar78._0_4_;
    auVar196._4_4_ = auVar293._4_4_ * auVar78._4_4_;
    auVar196._8_4_ = auVar293._8_4_ * auVar78._8_4_;
    auVar196._12_4_ = auVar293._12_4_ * auVar78._12_4_;
    auVar78 = vsubps_avx(auVar196,auVar239);
    auVar293 = vshufps_avx(auVar78,auVar78,0xc9);
    auVar78 = vshufps_avx(auVar139,auVar139,0xc9);
    auVar221 = vshufps_avx(auVar266,auVar266,0xc9);
    fVar191 = auVar139._0_4_;
    auVar197._0_4_ = fVar191 * auVar221._0_4_;
    fVar100 = auVar139._4_4_;
    auVar197._4_4_ = fVar100 * auVar221._4_4_;
    fVar101 = auVar139._8_4_;
    auVar197._8_4_ = fVar101 * auVar221._8_4_;
    fVar102 = auVar139._12_4_;
    auVar197._12_4_ = fVar102 * auVar221._12_4_;
    auVar267._0_4_ = auVar266._0_4_ * auVar78._0_4_;
    auVar267._4_4_ = auVar266._4_4_ * auVar78._4_4_;
    auVar267._8_4_ = auVar266._8_4_ * auVar78._8_4_;
    auVar267._12_4_ = auVar266._12_4_ * auVar78._12_4_;
    auVar221 = vsubps_avx(auVar267,auVar197);
    auVar5 = vshufps_avx(auVar221,auVar221,0xc9);
    auVar221 = vshufps_avx(auVar6,auVar6,0xc9);
    auVar268._0_4_ = auVar221._0_4_ * fVar191;
    auVar268._4_4_ = auVar221._4_4_ * fVar100;
    auVar268._8_4_ = auVar221._8_4_ * fVar101;
    auVar268._12_4_ = auVar221._12_4_ * fVar102;
    auVar220._0_4_ = auVar78._0_4_ * auVar6._0_4_;
    auVar220._4_4_ = auVar78._4_4_ * auVar6._4_4_;
    auVar220._8_4_ = auVar78._8_4_ * auVar6._8_4_;
    auVar220._12_4_ = auVar78._12_4_ * auVar6._12_4_;
    auVar78 = vdpps_avx(auVar4,auVar4,0x7f);
    auVar221 = vsubps_avx(auVar220,auVar268);
    auVar6 = vshufps_avx(auVar221,auVar221,0xc9);
    fVar211 = auVar78._0_4_;
    auVar234 = ZEXT416((uint)fVar211);
    auVar221 = vrsqrtss_avx(auVar234,auVar234);
    fVar192 = auVar221._0_4_;
    auVar221 = ZEXT416((uint)(fVar192 * 1.5 - fVar211 * 0.5 * fVar192 * fVar192 * fVar192));
    auVar121 = vshufps_avx(auVar221,auVar221,0);
    fVar192 = auVar4._0_4_ * auVar121._0_4_;
    fVar217 = auVar4._4_4_ * auVar121._4_4_;
    fVar210 = auVar4._8_4_ * auVar121._8_4_;
    fVar230 = auVar4._12_4_ * auVar121._12_4_;
    auVar221 = vdpps_avx(auVar4,auVar293,0x7f);
    auVar78 = vshufps_avx(auVar78,auVar78,0);
    auVar282._0_4_ = auVar293._0_4_ * auVar78._0_4_;
    auVar282._4_4_ = auVar293._4_4_ * auVar78._4_4_;
    auVar282._8_4_ = auVar293._8_4_ * auVar78._8_4_;
    auVar282._12_4_ = auVar293._12_4_ * auVar78._12_4_;
    auVar78 = vshufps_avx(auVar221,auVar221,0);
    auVar255._0_4_ = auVar4._0_4_ * auVar78._0_4_;
    auVar255._4_4_ = auVar4._4_4_ * auVar78._4_4_;
    auVar255._8_4_ = auVar4._8_4_ * auVar78._8_4_;
    auVar255._12_4_ = auVar4._12_4_ * auVar78._12_4_;
    auVar110 = vsubps_avx(auVar282,auVar255);
    auVar78 = vrcpss_avx(auVar234,auVar234);
    auVar78 = ZEXT416((uint)(auVar78._0_4_ * (2.0 - fVar211 * auVar78._0_4_)));
    auVar4 = vshufps_avx(auVar78,auVar78,0);
    auVar78 = vdpps_avx(auVar5,auVar5,0x7f);
    fVar211 = auVar78._0_4_;
    auVar234 = ZEXT416((uint)fVar211);
    auVar221 = vrsqrtss_avx(auVar234,auVar234);
    fVar231 = auVar221._0_4_;
    auVar221 = vdpps_avx(auVar5,auVar6,0x7f);
    auVar293 = ZEXT416((uint)(fVar231 * 1.5 - fVar211 * 0.5 * fVar231 * fVar231 * fVar231));
    auVar293 = vshufps_avx(auVar293,auVar293,0);
    fVar231 = auVar293._0_4_ * auVar5._0_4_;
    fVar212 = auVar293._4_4_ * auVar5._4_4_;
    fVar232 = auVar293._8_4_ * auVar5._8_4_;
    fVar213 = auVar293._12_4_ * auVar5._12_4_;
    auVar78 = vshufps_avx(auVar78,auVar78,0);
    auVar240._0_4_ = auVar78._0_4_ * auVar6._0_4_;
    auVar240._4_4_ = auVar78._4_4_ * auVar6._4_4_;
    auVar240._8_4_ = auVar78._8_4_ * auVar6._8_4_;
    auVar240._12_4_ = auVar78._12_4_ * auVar6._12_4_;
    auVar78 = vshufps_avx(auVar221,auVar221,0);
    auVar198._0_4_ = auVar78._0_4_ * auVar5._0_4_;
    auVar198._4_4_ = auVar78._4_4_ * auVar5._4_4_;
    auVar198._8_4_ = auVar78._8_4_ * auVar5._8_4_;
    auVar198._12_4_ = auVar78._12_4_ * auVar5._12_4_;
    auVar6 = vsubps_avx(auVar240,auVar198);
    auVar78 = vrcpss_avx(auVar234,auVar234);
    auVar78 = ZEXT416((uint)((2.0 - fVar211 * auVar78._0_4_) * auVar78._0_4_));
    auVar78 = vshufps_avx(auVar78,auVar78,0);
    auVar221 = vshufps_avx(_local_5c8,_local_5c8,0xff);
    auVar269._0_4_ = auVar221._0_4_ * fVar192;
    auVar269._4_4_ = auVar221._4_4_ * fVar217;
    auVar269._8_4_ = auVar221._8_4_ * fVar210;
    auVar269._12_4_ = auVar221._12_4_ * fVar230;
    _local_3e8 = vsubps_avx(_local_5c8,auVar269);
    auVar5 = vshufps_avx(auVar109,auVar109,0xff);
    auVar222._0_4_ =
         auVar5._0_4_ * fVar192 + auVar121._0_4_ * auVar110._0_4_ * auVar4._0_4_ * auVar221._0_4_;
    auVar222._4_4_ =
         auVar5._4_4_ * fVar217 + auVar121._4_4_ * auVar110._4_4_ * auVar4._4_4_ * auVar221._4_4_;
    auVar222._8_4_ =
         auVar5._8_4_ * fVar210 + auVar121._8_4_ * auVar110._8_4_ * auVar4._8_4_ * auVar221._8_4_;
    auVar222._12_4_ =
         auVar5._12_4_ * fVar230 +
         auVar121._12_4_ * auVar110._12_4_ * auVar4._12_4_ * auVar221._12_4_;
    auVar5 = vsubps_avx(auVar109,auVar222);
    local_3f8._0_4_ = auVar269._0_4_ + (float)local_5c8._0_4_;
    local_3f8._4_4_ = auVar269._4_4_ + (float)local_5c8._4_4_;
    fStack_3f0 = auVar269._8_4_ + fStack_5c0;
    fStack_3ec = auVar269._12_4_ + fStack_5bc;
    auVar221 = vshufps_avx(_local_5d8,_local_5d8,0xff);
    auVar135._0_4_ = fVar231 * auVar221._0_4_;
    auVar135._4_4_ = fVar212 * auVar221._4_4_;
    auVar135._8_4_ = fVar232 * auVar221._8_4_;
    auVar135._12_4_ = fVar213 * auVar221._12_4_;
    _local_408 = vsubps_avx(_local_5d8,auVar135);
    auVar4 = vshufps_avx(auVar139,auVar139,0xff);
    auVar105._0_4_ =
         fVar231 * auVar4._0_4_ + auVar221._0_4_ * auVar293._0_4_ * auVar6._0_4_ * auVar78._0_4_;
    auVar105._4_4_ =
         fVar212 * auVar4._4_4_ + auVar221._4_4_ * auVar293._4_4_ * auVar6._4_4_ * auVar78._4_4_;
    auVar105._8_4_ =
         fVar232 * auVar4._8_4_ + auVar221._8_4_ * auVar293._8_4_ * auVar6._8_4_ * auVar78._8_4_;
    auVar105._12_4_ =
         fVar213 * auVar4._12_4_ +
         auVar221._12_4_ * auVar293._12_4_ * auVar6._12_4_ * auVar78._12_4_;
    auVar293 = vsubps_avx(auVar139,auVar105);
    fVar215 = (float)local_5d8._0_4_ + auVar135._0_4_;
    fVar236 = (float)local_5d8._4_4_ + auVar135._4_4_;
    fVar170 = fStack_5d0 + auVar135._8_4_;
    fVar186 = fStack_5cc + auVar135._12_4_;
    local_418._0_4_ = local_3e8._0_4_ + auVar5._0_4_ * 0.33333334;
    local_418._4_4_ = local_3e8._4_4_ + auVar5._4_4_ * 0.33333334;
    fStack_410 = local_3e8._8_4_ + auVar5._8_4_ * 0.33333334;
    fStack_40c = local_3e8._12_4_ + auVar5._12_4_ * 0.33333334;
    local_2b8 = vsubps_avx(_local_3e8,auVar153);
    auVar221 = vmovsldup_avx(local_2b8);
    auVar78 = vmovshdup_avx(local_2b8);
    auVar4 = vshufps_avx(local_2b8,local_2b8,0xaa);
    fVar192 = pre->ray_space[k].vx.field_0.m128[0];
    fVar217 = pre->ray_space[k].vx.field_0.m128[1];
    fVar210 = pre->ray_space[k].vx.field_0.m128[2];
    fVar230 = pre->ray_space[k].vx.field_0.m128[3];
    fVar211 = pre->ray_space[k].vy.field_0.m128[0];
    fVar231 = pre->ray_space[k].vy.field_0.m128[1];
    fVar212 = pre->ray_space[k].vy.field_0.m128[2];
    fVar232 = pre->ray_space[k].vy.field_0.m128[3];
    fVar213 = pre->ray_space[k].vz.field_0.m128[0];
    fVar233 = pre->ray_space[k].vz.field_0.m128[1];
    fVar214 = pre->ray_space[k].vz.field_0.m128[2];
    fVar235 = pre->ray_space[k].vz.field_0.m128[3];
    fVar187 = fVar192 * auVar221._0_4_ + auVar4._0_4_ * fVar213 + fVar211 * auVar78._0_4_;
    fVar189 = fVar217 * auVar221._4_4_ + auVar4._4_4_ * fVar233 + fVar231 * auVar78._4_4_;
    local_5c8._4_4_ = fVar189;
    local_5c8._0_4_ = fVar187;
    fStack_5c0 = fVar210 * auVar221._8_4_ + auVar4._8_4_ * fVar214 + fVar212 * auVar78._8_4_;
    fStack_5bc = fVar230 * auVar221._12_4_ + auVar4._12_4_ * fVar235 + fVar232 * auVar78._12_4_;
    local_2c8 = vsubps_avx(_local_418,auVar153);
    auVar4 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar78 = vmovshdup_avx(local_2c8);
    auVar221 = vmovsldup_avx(local_2c8);
    fVar188 = auVar221._0_4_ * fVar192 + auVar78._0_4_ * fVar211 + fVar213 * auVar4._0_4_;
    fVar190 = auVar221._4_4_ * fVar217 + auVar78._4_4_ * fVar231 + fVar233 * auVar4._4_4_;
    local_578._4_4_ = fVar190;
    local_578._0_4_ = fVar188;
    fStack_570 = auVar221._8_4_ * fVar210 + auVar78._8_4_ * fVar212 + fVar214 * auVar4._8_4_;
    fStack_56c = auVar221._12_4_ * fVar230 + auVar78._12_4_ * fVar232 + fVar235 * auVar4._12_4_;
    auVar199._0_4_ = auVar293._0_4_ * 0.33333334;
    auVar199._4_4_ = auVar293._4_4_ * 0.33333334;
    auVar199._8_4_ = auVar293._8_4_ * 0.33333334;
    auVar199._12_4_ = auVar293._12_4_ * 0.33333334;
    _local_428 = vsubps_avx(_local_408,auVar199);
    local_2d8 = vsubps_avx(_local_428,auVar153);
    auVar4 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar78 = vmovshdup_avx(local_2d8);
    auVar221 = vmovsldup_avx(local_2d8);
    auVar330._0_4_ = auVar221._0_4_ * fVar192 + auVar78._0_4_ * fVar211 + fVar213 * auVar4._0_4_;
    auVar330._4_4_ = auVar221._4_4_ * fVar217 + auVar78._4_4_ * fVar231 + fVar233 * auVar4._4_4_;
    auVar330._8_4_ = auVar221._8_4_ * fVar210 + auVar78._8_4_ * fVar212 + fVar214 * auVar4._8_4_;
    auVar330._12_4_ = auVar221._12_4_ * fVar230 + auVar78._12_4_ * fVar232 + fVar235 * auVar4._12_4_
    ;
    local_2e8 = vsubps_avx(_local_408,auVar153);
    auVar4 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar78 = vmovshdup_avx(local_2e8);
    auVar221 = vmovsldup_avx(local_2e8);
    auVar323._0_4_ = auVar221._0_4_ * fVar192 + auVar78._0_4_ * fVar211 + auVar4._0_4_ * fVar213;
    auVar323._4_4_ = auVar221._4_4_ * fVar217 + auVar78._4_4_ * fVar231 + auVar4._4_4_ * fVar233;
    auVar323._8_4_ = auVar221._8_4_ * fVar210 + auVar78._8_4_ * fVar212 + auVar4._8_4_ * fVar214;
    auVar323._12_4_ = auVar221._12_4_ * fVar230 + auVar78._12_4_ * fVar232 + auVar4._12_4_ * fVar235
    ;
    local_2f8 = vsubps_avx(_local_3f8,auVar153);
    auVar4 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar78 = vmovshdup_avx(local_2f8);
    auVar221 = vmovsldup_avx(local_2f8);
    auVar318._0_4_ = auVar221._0_4_ * fVar192 + auVar78._0_4_ * fVar211 + auVar4._0_4_ * fVar213;
    auVar318._4_4_ = auVar221._4_4_ * fVar217 + auVar78._4_4_ * fVar231 + auVar4._4_4_ * fVar233;
    auVar318._8_4_ = auVar221._8_4_ * fVar210 + auVar78._8_4_ * fVar212 + auVar4._8_4_ * fVar214;
    auVar318._12_4_ = auVar221._12_4_ * fVar230 + auVar78._12_4_ * fVar232 + auVar4._12_4_ * fVar235
    ;
    local_438._0_4_ = (float)local_3f8._0_4_ + (fVar169 + auVar222._0_4_) * 0.33333334;
    local_438._4_4_ = (float)local_3f8._4_4_ + (fVar216 + auVar222._4_4_) * 0.33333334;
    fStack_430 = fStack_3f0 + (fVar252 + auVar222._8_4_) * 0.33333334;
    fStack_42c = fStack_3ec + (fVar253 + auVar222._12_4_) * 0.33333334;
    local_308 = vsubps_avx(_local_438,auVar153);
    auVar4 = vshufps_avx(local_308,local_308,0xaa);
    auVar78 = vmovshdup_avx(local_308);
    auVar221 = vmovsldup_avx(local_308);
    auVar283._0_4_ = auVar221._0_4_ * fVar192 + auVar78._0_4_ * fVar211 + auVar4._0_4_ * fVar213;
    auVar283._4_4_ = auVar221._4_4_ * fVar217 + auVar78._4_4_ * fVar231 + auVar4._4_4_ * fVar233;
    auVar283._8_4_ = auVar221._8_4_ * fVar210 + auVar78._8_4_ * fVar212 + auVar4._8_4_ * fVar214;
    auVar283._12_4_ = auVar221._12_4_ * fVar230 + auVar78._12_4_ * fVar232 + auVar4._12_4_ * fVar235
    ;
    auVar241._0_4_ = (fVar191 + auVar105._0_4_) * 0.33333334;
    auVar241._4_4_ = (fVar100 + auVar105._4_4_) * 0.33333334;
    auVar241._8_4_ = (fVar101 + auVar105._8_4_) * 0.33333334;
    auVar241._12_4_ = (fVar102 + auVar105._12_4_) * 0.33333334;
    auVar62._4_4_ = fVar236;
    auVar62._0_4_ = fVar215;
    auVar62._8_4_ = fVar170;
    auVar62._12_4_ = fVar186;
    _local_348 = vsubps_avx(auVar62,auVar241);
    local_318 = vsubps_avx(_local_348,auVar153);
    auVar4 = vshufps_avx(local_318,local_318,0xaa);
    auVar78 = vmovshdup_avx(local_318);
    auVar221 = vmovsldup_avx(local_318);
    auVar106._0_4_ = auVar221._0_4_ * fVar192 + auVar78._0_4_ * fVar211 + fVar213 * auVar4._0_4_;
    auVar106._4_4_ = auVar221._4_4_ * fVar217 + auVar78._4_4_ * fVar231 + fVar233 * auVar4._4_4_;
    auVar106._8_4_ = auVar221._8_4_ * fVar210 + auVar78._8_4_ * fVar212 + fVar214 * auVar4._8_4_;
    auVar106._12_4_ = auVar221._12_4_ * fVar230 + auVar78._12_4_ * fVar232 + fVar235 * auVar4._12_4_
    ;
    local_328 = vsubps_avx(auVar62,auVar153);
    auVar153 = vshufps_avx(local_328,local_328,0xaa);
    auVar78 = vmovshdup_avx(local_328);
    auVar221 = vmovsldup_avx(local_328);
    auVar73._0_4_ = fVar192 * auVar221._0_4_ + fVar211 * auVar78._0_4_ + fVar213 * auVar153._0_4_;
    auVar73._4_4_ = fVar217 * auVar221._4_4_ + fVar231 * auVar78._4_4_ + fVar233 * auVar153._4_4_;
    auVar73._8_4_ = fVar210 * auVar221._8_4_ + fVar212 * auVar78._8_4_ + fVar214 * auVar153._8_4_;
    auVar73._12_4_ =
         fVar230 * auVar221._12_4_ + fVar232 * auVar78._12_4_ + fVar235 * auVar153._12_4_;
    auVar4 = vmovlhps_avx(_local_5c8,auVar318);
    auVar293 = vmovlhps_avx(_local_578,auVar283);
    auVar5 = vmovlhps_avx(auVar330,auVar106);
    auVar6 = vmovlhps_avx(auVar323,auVar73);
    auVar78 = vminps_avx(auVar4,auVar293);
    auVar221 = vminps_avx(auVar5,auVar6);
    auVar153 = vminps_avx(auVar78,auVar221);
    auVar78 = vmaxps_avx(auVar4,auVar293);
    auVar221 = vmaxps_avx(auVar5,auVar6);
    auVar78 = vmaxps_avx(auVar78,auVar221);
    auVar221 = vshufpd_avx(auVar153,auVar153,3);
    auVar153 = vminps_avx(auVar153,auVar221);
    auVar221 = vshufpd_avx(auVar78,auVar78,3);
    auVar221 = vmaxps_avx(auVar78,auVar221);
    auVar223._8_4_ = 0x7fffffff;
    auVar223._0_8_ = 0x7fffffff7fffffff;
    auVar223._12_4_ = 0x7fffffff;
    auVar78 = vandps_avx(auVar153,auVar223);
    auVar221 = vandps_avx(auVar221,auVar223);
    auVar78 = vmaxps_avx(auVar78,auVar221);
    auVar221 = vmovshdup_avx(auVar78);
    auVar78 = vmaxss_avx(auVar221,auVar78);
    fVar192 = auVar78._0_4_ * 9.536743e-07;
    local_278 = ZEXT416((uint)fVar192);
    auVar78 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
    local_248._16_16_ = auVar78;
    local_248._0_16_ = auVar78;
    auVar74._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
    auVar74._8_4_ = auVar78._8_4_ ^ 0x80000000;
    auVar74._12_4_ = auVar78._12_4_ ^ 0x80000000;
    local_268._16_16_ = auVar74;
    local_268._0_16_ = auVar74;
    local_398 = vpshufd_avx(ZEXT416(uVar64),0);
    local_3a8 = vpshufd_avx(ZEXT416(uVar8),0);
    uVar67 = 0;
    fVar192 = *(float *)(ray + k * 4 + 0x30);
    _local_288 = vsubps_avx(auVar293,auVar4);
    _local_298 = vsubps_avx(auVar5,auVar293);
    _local_2a8 = vsubps_avx(auVar6,auVar5);
    _local_358 = vsubps_avx(_local_3f8,_local_3e8);
    _local_368 = vsubps_avx(_local_438,_local_418);
    _local_378 = vsubps_avx(_local_348,_local_428);
    auVar63._4_4_ = fVar236;
    auVar63._0_4_ = fVar215;
    auVar63._8_4_ = fVar170;
    auVar63._12_4_ = fVar186;
    _local_388 = vsubps_avx(auVar63,_local_408);
    auVar302 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar308 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_010361ca:
    auVar104 = auVar302._0_16_;
    auVar133 = auVar308._0_16_;
    local_338 = auVar133;
    auVar78 = vshufps_avx(auVar104,auVar104,0x50);
    auVar324._8_4_ = 0x3f800000;
    auVar324._0_8_ = 0x3f8000003f800000;
    auVar324._12_4_ = 0x3f800000;
    auVar329._16_4_ = 0x3f800000;
    auVar329._0_16_ = auVar324;
    auVar329._20_4_ = 0x3f800000;
    auVar329._24_4_ = 0x3f800000;
    auVar329._28_4_ = 0x3f800000;
    auVar221 = vsubps_avx(auVar324,auVar78);
    fVar217 = auVar78._0_4_;
    fVar210 = auVar78._4_4_;
    fVar230 = auVar78._8_4_;
    fVar211 = auVar78._12_4_;
    fVar231 = auVar221._0_4_;
    fVar212 = auVar221._4_4_;
    fVar232 = auVar221._8_4_;
    fVar213 = auVar221._12_4_;
    auVar160._0_4_ = auVar318._0_4_ * fVar217 + fVar231 * fVar187;
    auVar160._4_4_ = auVar318._4_4_ * fVar210 + fVar212 * fVar189;
    auVar160._8_4_ = auVar318._0_4_ * fVar230 + fVar232 * fVar187;
    auVar160._12_4_ = auVar318._4_4_ * fVar211 + fVar213 * fVar189;
    auVar136._0_4_ = auVar283._0_4_ * fVar217 + fVar231 * fVar188;
    auVar136._4_4_ = auVar283._4_4_ * fVar210 + fVar212 * fVar190;
    auVar136._8_4_ = auVar283._0_4_ * fVar230 + fVar232 * fVar188;
    auVar136._12_4_ = auVar283._4_4_ * fVar211 + fVar213 * fVar190;
    auVar242._0_4_ = auVar106._0_4_ * fVar217 + auVar330._0_4_ * fVar231;
    auVar242._4_4_ = auVar106._4_4_ * fVar210 + auVar330._4_4_ * fVar212;
    auVar242._8_4_ = auVar106._0_4_ * fVar230 + auVar330._0_4_ * fVar232;
    auVar242._12_4_ = auVar106._4_4_ * fVar211 + auVar330._4_4_ * fVar213;
    auVar172._0_4_ = auVar73._0_4_ * fVar217 + auVar323._0_4_ * fVar231;
    auVar172._4_4_ = auVar73._4_4_ * fVar210 + auVar323._4_4_ * fVar212;
    auVar172._8_4_ = auVar73._0_4_ * fVar230 + auVar323._0_4_ * fVar232;
    auVar172._12_4_ = auVar73._4_4_ * fVar211 + auVar323._4_4_ * fVar213;
    auVar78 = vmovshdup_avx(auVar133);
    auVar221 = vshufps_avx(auVar133,auVar133,0);
    auVar274._16_16_ = auVar221;
    auVar274._0_16_ = auVar221;
    auVar153 = vshufps_avx(auVar133,auVar133,0x55);
    auVar94._16_16_ = auVar153;
    auVar94._0_16_ = auVar153;
    auVar90 = vsubps_avx(auVar94,auVar274);
    auVar153 = vshufps_avx(auVar160,auVar160,0);
    auVar121 = vshufps_avx(auVar160,auVar160,0x55);
    auVar109 = vshufps_avx(auVar136,auVar136,0);
    auVar139 = vshufps_avx(auVar136,auVar136,0x55);
    auVar110 = vshufps_avx(auVar242,auVar242,0);
    auVar234 = vshufps_avx(auVar242,auVar242,0x55);
    auVar72 = vshufps_avx(auVar172,auVar172,0);
    auVar103 = vshufps_avx(auVar172,auVar172,0x55);
    auVar78 = ZEXT416((uint)((auVar78._0_4_ - auVar308._0_4_) * 0.04761905));
    auVar78 = vshufps_avx(auVar78,auVar78,0);
    auVar289._0_4_ = auVar221._0_4_ + auVar90._0_4_ * 0.0;
    auVar289._4_4_ = auVar221._4_4_ + auVar90._4_4_ * 0.14285715;
    auVar289._8_4_ = auVar221._8_4_ + auVar90._8_4_ * 0.2857143;
    auVar289._12_4_ = auVar221._12_4_ + auVar90._12_4_ * 0.42857146;
    auVar289._16_4_ = auVar221._0_4_ + auVar90._16_4_ * 0.5714286;
    auVar289._20_4_ = auVar221._4_4_ + auVar90._20_4_ * 0.71428573;
    auVar289._24_4_ = auVar221._8_4_ + auVar90._24_4_ * 0.8571429;
    auVar289._28_4_ = auVar221._12_4_ + auVar90._28_4_;
    auVar16 = vsubps_avx(auVar329,auVar289);
    fVar217 = auVar109._0_4_;
    fVar230 = auVar109._4_4_;
    fVar231 = auVar109._8_4_;
    fVar232 = auVar109._12_4_;
    fVar264 = auVar16._0_4_;
    fVar276 = auVar16._4_4_;
    fVar277 = auVar16._8_4_;
    fVar278 = auVar16._12_4_;
    fVar279 = auVar16._16_4_;
    fVar280 = auVar16._20_4_;
    fVar281 = auVar16._24_4_;
    fVar260 = auVar139._0_4_;
    fVar261 = auVar139._4_4_;
    fVar262 = auVar139._8_4_;
    fVar263 = auVar139._12_4_;
    fVar321 = auVar121._12_4_ + 1.0;
    fVar216 = auVar110._0_4_;
    fVar252 = auVar110._4_4_;
    fVar253 = auVar110._8_4_;
    fVar259 = auVar110._12_4_;
    fVar233 = fVar216 * auVar289._0_4_ + fVar264 * fVar217;
    fVar214 = fVar252 * auVar289._4_4_ + fVar276 * fVar230;
    fVar235 = fVar253 * auVar289._8_4_ + fVar277 * fVar231;
    fVar191 = fVar259 * auVar289._12_4_ + fVar278 * fVar232;
    fVar100 = fVar216 * auVar289._16_4_ + fVar279 * fVar217;
    fVar101 = fVar252 * auVar289._20_4_ + fVar280 * fVar230;
    fVar102 = fVar253 * auVar289._24_4_ + fVar281 * fVar231;
    fVar210 = auVar234._0_4_;
    fVar211 = auVar234._4_4_;
    fVar212 = auVar234._8_4_;
    fVar213 = auVar234._12_4_;
    fVar303 = fVar260 * fVar264 + auVar289._0_4_ * fVar210;
    fVar309 = fVar261 * fVar276 + auVar289._4_4_ * fVar211;
    fVar310 = fVar262 * fVar277 + auVar289._8_4_ * fVar212;
    fVar311 = fVar263 * fVar278 + auVar289._12_4_ * fVar213;
    fVar312 = fVar260 * fVar279 + auVar289._16_4_ * fVar210;
    fVar313 = fVar261 * fVar280 + auVar289._20_4_ * fVar211;
    fVar314 = fVar262 * fVar281 + auVar289._24_4_ * fVar212;
    fVar315 = fVar263 + fVar232;
    auVar221 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar109 = vshufps_avx(auVar160,auVar160,0xff);
    fVar169 = fVar259 + 0.0;
    auVar139 = vshufps_avx(auVar136,auVar136,0xaa);
    auVar110 = vshufps_avx(auVar136,auVar136,0xff);
    auVar184._0_4_ =
         fVar264 * (auVar289._0_4_ * fVar217 + fVar264 * auVar153._0_4_) + auVar289._0_4_ * fVar233;
    auVar184._4_4_ =
         fVar276 * (auVar289._4_4_ * fVar230 + fVar276 * auVar153._4_4_) + auVar289._4_4_ * fVar214;
    auVar184._8_4_ =
         fVar277 * (auVar289._8_4_ * fVar231 + fVar277 * auVar153._8_4_) + auVar289._8_4_ * fVar235;
    auVar184._12_4_ =
         fVar278 * (auVar289._12_4_ * fVar232 + fVar278 * auVar153._12_4_) +
         auVar289._12_4_ * fVar191;
    auVar184._16_4_ =
         fVar279 * (auVar289._16_4_ * fVar217 + fVar279 * auVar153._0_4_) +
         auVar289._16_4_ * fVar100;
    auVar184._20_4_ =
         fVar280 * (auVar289._20_4_ * fVar230 + fVar280 * auVar153._4_4_) +
         auVar289._20_4_ * fVar101;
    auVar184._24_4_ =
         fVar281 * (auVar289._24_4_ * fVar231 + fVar281 * auVar153._8_4_) +
         auVar289._24_4_ * fVar102;
    auVar184._28_4_ = auVar153._12_4_ + 1.0 + fVar213;
    auVar208._0_4_ =
         fVar264 * (fVar260 * auVar289._0_4_ + auVar121._0_4_ * fVar264) + auVar289._0_4_ * fVar303;
    auVar208._4_4_ =
         fVar276 * (fVar261 * auVar289._4_4_ + auVar121._4_4_ * fVar276) + auVar289._4_4_ * fVar309;
    auVar208._8_4_ =
         fVar277 * (fVar262 * auVar289._8_4_ + auVar121._8_4_ * fVar277) + auVar289._8_4_ * fVar310;
    auVar208._12_4_ =
         fVar278 * (fVar263 * auVar289._12_4_ + auVar121._12_4_ * fVar278) +
         auVar289._12_4_ * fVar311;
    auVar208._16_4_ =
         fVar279 * (fVar260 * auVar289._16_4_ + auVar121._0_4_ * fVar279) +
         auVar289._16_4_ * fVar312;
    auVar208._20_4_ =
         fVar280 * (fVar261 * auVar289._20_4_ + auVar121._4_4_ * fVar280) +
         auVar289._20_4_ * fVar313;
    auVar208._24_4_ =
         fVar281 * (fVar262 * auVar289._24_4_ + auVar121._8_4_ * fVar281) +
         auVar289._24_4_ * fVar314;
    auVar208._28_4_ = auVar103._12_4_ + fVar213;
    auVar95._0_4_ =
         fVar264 * fVar233 + auVar289._0_4_ * (fVar216 * fVar264 + auVar72._0_4_ * auVar289._0_4_);
    auVar95._4_4_ =
         fVar276 * fVar214 + auVar289._4_4_ * (fVar252 * fVar276 + auVar72._4_4_ * auVar289._4_4_);
    auVar95._8_4_ =
         fVar277 * fVar235 + auVar289._8_4_ * (fVar253 * fVar277 + auVar72._8_4_ * auVar289._8_4_);
    auVar95._12_4_ =
         fVar278 * fVar191 +
         auVar289._12_4_ * (fVar259 * fVar278 + auVar72._12_4_ * auVar289._12_4_);
    auVar95._16_4_ =
         fVar279 * fVar100 + auVar289._16_4_ * (fVar216 * fVar279 + auVar72._0_4_ * auVar289._16_4_)
    ;
    auVar95._20_4_ =
         fVar280 * fVar101 + auVar289._20_4_ * (fVar252 * fVar280 + auVar72._4_4_ * auVar289._20_4_)
    ;
    auVar95._24_4_ =
         fVar281 * fVar102 + auVar289._24_4_ * (fVar253 * fVar281 + auVar72._8_4_ * auVar289._24_4_)
    ;
    auVar95._28_4_ = fVar232 + 1.0 + fVar169;
    auVar301._0_4_ =
         fVar264 * fVar303 + auVar289._0_4_ * (auVar103._0_4_ * auVar289._0_4_ + fVar264 * fVar210);
    auVar301._4_4_ =
         fVar276 * fVar309 + auVar289._4_4_ * (auVar103._4_4_ * auVar289._4_4_ + fVar276 * fVar211);
    auVar301._8_4_ =
         fVar277 * fVar310 + auVar289._8_4_ * (auVar103._8_4_ * auVar289._8_4_ + fVar277 * fVar212);
    auVar301._12_4_ =
         fVar278 * fVar311 +
         auVar289._12_4_ * (auVar103._12_4_ * auVar289._12_4_ + fVar278 * fVar213);
    auVar301._16_4_ =
         fVar279 * fVar312 +
         auVar289._16_4_ * (auVar103._0_4_ * auVar289._16_4_ + fVar279 * fVar210);
    auVar301._20_4_ =
         fVar280 * fVar313 +
         auVar289._20_4_ * (auVar103._4_4_ * auVar289._20_4_ + fVar280 * fVar211);
    auVar301._24_4_ =
         fVar281 * fVar314 +
         auVar289._24_4_ * (auVar103._8_4_ * auVar289._24_4_ + fVar281 * fVar212);
    auVar301._28_4_ = fVar169 + fVar213 + 0.0;
    local_98._0_4_ = fVar264 * auVar184._0_4_ + auVar289._0_4_ * auVar95._0_4_;
    local_98._4_4_ = fVar276 * auVar184._4_4_ + auVar289._4_4_ * auVar95._4_4_;
    local_98._8_4_ = fVar277 * auVar184._8_4_ + auVar289._8_4_ * auVar95._8_4_;
    local_98._12_4_ = fVar278 * auVar184._12_4_ + auVar289._12_4_ * auVar95._12_4_;
    local_98._16_4_ = fVar279 * auVar184._16_4_ + auVar289._16_4_ * auVar95._16_4_;
    local_98._20_4_ = fVar280 * auVar184._20_4_ + auVar289._20_4_ * auVar95._20_4_;
    local_98._24_4_ = fVar281 * auVar184._24_4_ + auVar289._24_4_ * auVar95._24_4_;
    local_98._28_4_ = fVar315 + fVar213 + 0.0;
    auVar168._0_4_ = fVar264 * auVar208._0_4_ + auVar289._0_4_ * auVar301._0_4_;
    auVar168._4_4_ = fVar276 * auVar208._4_4_ + auVar289._4_4_ * auVar301._4_4_;
    auVar168._8_4_ = fVar277 * auVar208._8_4_ + auVar289._8_4_ * auVar301._8_4_;
    auVar168._12_4_ = fVar278 * auVar208._12_4_ + auVar289._12_4_ * auVar301._12_4_;
    auVar168._16_4_ = fVar279 * auVar208._16_4_ + auVar289._16_4_ * auVar301._16_4_;
    auVar168._20_4_ = fVar280 * auVar208._20_4_ + auVar289._20_4_ * auVar301._20_4_;
    auVar168._24_4_ = fVar281 * auVar208._24_4_ + auVar289._24_4_ * auVar301._24_4_;
    auVar168._28_4_ = fVar315 + fVar169;
    auVar17 = vsubps_avx(auVar95,auVar184);
    auVar90 = vsubps_avx(auVar301,auVar208);
    local_4e8 = auVar78._0_4_;
    fStack_4e4 = auVar78._4_4_;
    fStack_4e0 = auVar78._8_4_;
    fStack_4dc = auVar78._12_4_;
    local_d8 = local_4e8 * auVar17._0_4_ * 3.0;
    fStack_d4 = fStack_4e4 * auVar17._4_4_ * 3.0;
    auVar24._4_4_ = fStack_d4;
    auVar24._0_4_ = local_d8;
    fStack_d0 = fStack_4e0 * auVar17._8_4_ * 3.0;
    auVar24._8_4_ = fStack_d0;
    fStack_cc = fStack_4dc * auVar17._12_4_ * 3.0;
    auVar24._12_4_ = fStack_cc;
    fStack_c8 = local_4e8 * auVar17._16_4_ * 3.0;
    auVar24._16_4_ = fStack_c8;
    fStack_c4 = fStack_4e4 * auVar17._20_4_ * 3.0;
    auVar24._20_4_ = fStack_c4;
    fStack_c0 = fStack_4e0 * auVar17._24_4_ * 3.0;
    auVar24._24_4_ = fStack_c0;
    auVar24._28_4_ = auVar17._28_4_;
    local_f8 = local_4e8 * auVar90._0_4_ * 3.0;
    fStack_f4 = fStack_4e4 * auVar90._4_4_ * 3.0;
    auVar25._4_4_ = fStack_f4;
    auVar25._0_4_ = local_f8;
    fStack_f0 = fStack_4e0 * auVar90._8_4_ * 3.0;
    auVar25._8_4_ = fStack_f0;
    fStack_ec = fStack_4dc * auVar90._12_4_ * 3.0;
    auVar25._12_4_ = fStack_ec;
    fStack_e8 = local_4e8 * auVar90._16_4_ * 3.0;
    auVar25._16_4_ = fStack_e8;
    fStack_e4 = fStack_4e4 * auVar90._20_4_ * 3.0;
    auVar25._20_4_ = fStack_e4;
    fStack_e0 = fStack_4e0 * auVar90._24_4_ * 3.0;
    auVar25._24_4_ = fStack_e0;
    auVar25._28_4_ = fVar315;
    auVar14 = vsubps_avx(local_98,auVar24);
    auVar90 = vperm2f128_avx(auVar14,auVar14,1);
    auVar90 = vshufps_avx(auVar90,auVar14,0x30);
    auVar90 = vshufps_avx(auVar14,auVar90,0x29);
    auVar15 = vsubps_avx(auVar168,auVar25);
    auVar14 = vperm2f128_avx(auVar15,auVar15,1);
    auVar14 = vshufps_avx(auVar14,auVar15,0x30);
    auVar15 = vshufps_avx(auVar15,auVar14,0x29);
    fVar313 = auVar139._0_4_;
    fVar314 = auVar139._4_4_;
    fVar333 = auVar139._8_4_;
    fVar232 = auVar221._12_4_;
    fVar252 = auVar110._0_4_;
    fVar259 = auVar110._4_4_;
    fVar303 = auVar110._8_4_;
    fVar309 = auVar110._12_4_;
    auVar78 = vshufps_avx(auVar242,auVar242,0xaa);
    fVar217 = auVar78._0_4_;
    fVar230 = auVar78._4_4_;
    fVar231 = auVar78._8_4_;
    fVar213 = auVar78._12_4_;
    fVar235 = auVar289._0_4_ * fVar217 + fVar313 * fVar264;
    fVar191 = auVar289._4_4_ * fVar230 + fVar314 * fVar276;
    fVar100 = auVar289._8_4_ * fVar231 + fVar333 * fVar277;
    fVar101 = auVar289._12_4_ * fVar213 + auVar139._12_4_ * fVar278;
    fVar102 = auVar289._16_4_ * fVar217 + fVar313 * fVar279;
    fVar169 = auVar289._20_4_ * fVar230 + fVar314 * fVar280;
    fVar216 = auVar289._24_4_ * fVar231 + fVar333 * fVar281;
    auVar78 = vshufps_avx(auVar242,auVar242,0xff);
    fVar210 = auVar78._0_4_;
    fVar211 = auVar78._4_4_;
    fVar212 = auVar78._8_4_;
    fVar233 = auVar78._12_4_;
    fVar253 = auVar289._0_4_ * fVar210 + fVar252 * fVar264;
    fVar260 = auVar289._4_4_ * fVar211 + fVar259 * fVar276;
    fVar261 = auVar289._8_4_ * fVar212 + fVar303 * fVar277;
    fVar262 = auVar289._12_4_ * fVar233 + fVar309 * fVar278;
    fVar310 = auVar289._16_4_ * fVar210 + fVar252 * fVar279;
    fVar263 = auVar289._20_4_ * fVar211 + fVar259 * fVar280;
    fVar311 = auVar289._24_4_ * fVar212 + fVar303 * fVar281;
    auVar78 = vshufps_avx(auVar172,auVar172,0xaa);
    fVar312 = auVar78._12_4_ + fVar213;
    auVar153 = vshufps_avx(auVar172,auVar172,0xff);
    fVar214 = auVar153._12_4_;
    auVar96._0_4_ =
         fVar264 * (fVar313 * auVar289._0_4_ + fVar264 * auVar221._0_4_) + auVar289._0_4_ * fVar235;
    auVar96._4_4_ =
         fVar276 * (fVar314 * auVar289._4_4_ + fVar276 * auVar221._4_4_) + auVar289._4_4_ * fVar191;
    auVar96._8_4_ =
         fVar277 * (fVar333 * auVar289._8_4_ + fVar277 * auVar221._8_4_) + auVar289._8_4_ * fVar100;
    auVar96._12_4_ =
         fVar278 * (auVar139._12_4_ * auVar289._12_4_ + fVar278 * fVar232) +
         auVar289._12_4_ * fVar101;
    auVar96._16_4_ =
         fVar279 * (fVar313 * auVar289._16_4_ + fVar279 * auVar221._0_4_) +
         auVar289._16_4_ * fVar102;
    auVar96._20_4_ =
         fVar280 * (fVar314 * auVar289._20_4_ + fVar280 * auVar221._4_4_) +
         auVar289._20_4_ * fVar169;
    auVar96._24_4_ =
         fVar281 * (fVar333 * auVar289._24_4_ + fVar281 * auVar221._8_4_) +
         auVar289._24_4_ * fVar216;
    auVar96._28_4_ = auVar15._28_4_ + fVar232 + fVar214;
    auVar129._0_4_ =
         fVar264 * (fVar252 * auVar289._0_4_ + auVar109._0_4_ * fVar264) + auVar289._0_4_ * fVar253;
    auVar129._4_4_ =
         fVar276 * (fVar259 * auVar289._4_4_ + auVar109._4_4_ * fVar276) + auVar289._4_4_ * fVar260;
    auVar129._8_4_ =
         fVar277 * (fVar303 * auVar289._8_4_ + auVar109._8_4_ * fVar277) + auVar289._8_4_ * fVar261;
    auVar129._12_4_ =
         fVar278 * (fVar309 * auVar289._12_4_ + auVar109._12_4_ * fVar278) +
         auVar289._12_4_ * fVar262;
    auVar129._16_4_ =
         fVar279 * (fVar252 * auVar289._16_4_ + auVar109._0_4_ * fVar279) +
         auVar289._16_4_ * fVar310;
    auVar129._20_4_ =
         fVar280 * (fVar259 * auVar289._20_4_ + auVar109._4_4_ * fVar280) +
         auVar289._20_4_ * fVar263;
    auVar129._24_4_ =
         fVar281 * (fVar303 * auVar289._24_4_ + auVar109._8_4_ * fVar281) +
         auVar289._24_4_ * fVar311;
    auVar129._28_4_ = fVar232 + auVar14._28_4_ + fVar214;
    auVar14 = vperm2f128_avx(local_98,local_98,1);
    auVar14 = vshufps_avx(auVar14,local_98,0x30);
    _local_3d8 = vshufps_avx(local_98,auVar14,0x29);
    auVar209._0_4_ =
         auVar289._0_4_ * (auVar78._0_4_ * auVar289._0_4_ + fVar264 * fVar217) + fVar264 * fVar235;
    auVar209._4_4_ =
         auVar289._4_4_ * (auVar78._4_4_ * auVar289._4_4_ + fVar276 * fVar230) + fVar276 * fVar191;
    auVar209._8_4_ =
         auVar289._8_4_ * (auVar78._8_4_ * auVar289._8_4_ + fVar277 * fVar231) + fVar277 * fVar100;
    auVar209._12_4_ =
         auVar289._12_4_ * (auVar78._12_4_ * auVar289._12_4_ + fVar278 * fVar213) +
         fVar278 * fVar101;
    auVar209._16_4_ =
         auVar289._16_4_ * (auVar78._0_4_ * auVar289._16_4_ + fVar279 * fVar217) + fVar279 * fVar102
    ;
    auVar209._20_4_ =
         auVar289._20_4_ * (auVar78._4_4_ * auVar289._20_4_ + fVar280 * fVar230) + fVar280 * fVar169
    ;
    auVar209._24_4_ =
         auVar289._24_4_ * (auVar78._8_4_ * auVar289._24_4_ + fVar281 * fVar231) + fVar281 * fVar216
    ;
    auVar209._28_4_ = fVar312 + fVar321 + auVar208._28_4_;
    auVar258._0_4_ =
         fVar264 * fVar253 + auVar289._0_4_ * (auVar289._0_4_ * auVar153._0_4_ + fVar264 * fVar210);
    auVar258._4_4_ =
         fVar276 * fVar260 + auVar289._4_4_ * (auVar289._4_4_ * auVar153._4_4_ + fVar276 * fVar211);
    auVar258._8_4_ =
         fVar277 * fVar261 + auVar289._8_4_ * (auVar289._8_4_ * auVar153._8_4_ + fVar277 * fVar212);
    auVar258._12_4_ =
         fVar278 * fVar262 + auVar289._12_4_ * (auVar289._12_4_ * fVar214 + fVar278 * fVar233);
    auVar258._16_4_ =
         fVar279 * fVar310 +
         auVar289._16_4_ * (auVar289._16_4_ * auVar153._0_4_ + fVar279 * fVar210);
    auVar258._20_4_ =
         fVar280 * fVar263 +
         auVar289._20_4_ * (auVar289._20_4_ * auVar153._4_4_ + fVar280 * fVar211);
    auVar258._24_4_ =
         fVar281 * fVar311 +
         auVar289._24_4_ * (auVar289._24_4_ * auVar153._8_4_ + fVar281 * fVar212);
    auVar258._28_4_ = fVar321 + fVar309 + fVar214 + fVar233;
    auVar251._0_4_ = fVar264 * auVar96._0_4_ + auVar289._0_4_ * auVar209._0_4_;
    auVar251._4_4_ = fVar276 * auVar96._4_4_ + auVar289._4_4_ * auVar209._4_4_;
    auVar251._8_4_ = fVar277 * auVar96._8_4_ + auVar289._8_4_ * auVar209._8_4_;
    auVar251._12_4_ = fVar278 * auVar96._12_4_ + auVar289._12_4_ * auVar209._12_4_;
    auVar251._16_4_ = fVar279 * auVar96._16_4_ + auVar289._16_4_ * auVar209._16_4_;
    auVar251._20_4_ = fVar280 * auVar96._20_4_ + auVar289._20_4_ * auVar209._20_4_;
    auVar251._24_4_ = fVar281 * auVar96._24_4_ + auVar289._24_4_ * auVar209._24_4_;
    auVar251._28_4_ = fVar312 + fVar214 + fVar233;
    auVar275._0_4_ = fVar264 * auVar129._0_4_ + auVar289._0_4_ * auVar258._0_4_;
    auVar275._4_4_ = fVar276 * auVar129._4_4_ + auVar289._4_4_ * auVar258._4_4_;
    auVar275._8_4_ = fVar277 * auVar129._8_4_ + auVar289._8_4_ * auVar258._8_4_;
    auVar275._12_4_ = fVar278 * auVar129._12_4_ + auVar289._12_4_ * auVar258._12_4_;
    auVar275._16_4_ = fVar279 * auVar129._16_4_ + auVar289._16_4_ * auVar258._16_4_;
    auVar275._20_4_ = fVar280 * auVar129._20_4_ + auVar289._20_4_ * auVar258._20_4_;
    auVar275._24_4_ = fVar281 * auVar129._24_4_ + auVar289._24_4_ * auVar258._24_4_;
    auVar275._28_4_ = auVar16._28_4_ + auVar289._28_4_;
    auVar20 = vsubps_avx(auVar209,auVar96);
    auVar14 = vsubps_avx(auVar258,auVar129);
    local_118 = local_4e8 * auVar20._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar20._4_4_ * 3.0;
    auVar26._4_4_ = fStack_114;
    auVar26._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar20._8_4_ * 3.0;
    auVar26._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar20._12_4_ * 3.0;
    auVar26._12_4_ = fStack_10c;
    fStack_108 = local_4e8 * auVar20._16_4_ * 3.0;
    auVar26._16_4_ = fStack_108;
    fStack_104 = fStack_4e4 * auVar20._20_4_ * 3.0;
    auVar26._20_4_ = fStack_104;
    fStack_100 = fStack_4e0 * auVar20._24_4_ * 3.0;
    auVar26._24_4_ = fStack_100;
    auVar26._28_4_ = auVar20._28_4_;
    local_138 = local_4e8 * auVar14._0_4_ * 3.0;
    fStack_134 = fStack_4e4 * auVar14._4_4_ * 3.0;
    auVar27._4_4_ = fStack_134;
    auVar27._0_4_ = local_138;
    fStack_130 = fStack_4e0 * auVar14._8_4_ * 3.0;
    auVar27._8_4_ = fStack_130;
    fStack_12c = fStack_4dc * auVar14._12_4_ * 3.0;
    auVar27._12_4_ = fStack_12c;
    fStack_128 = local_4e8 * auVar14._16_4_ * 3.0;
    auVar27._16_4_ = fStack_128;
    fStack_124 = fStack_4e4 * auVar14._20_4_ * 3.0;
    auVar27._20_4_ = fStack_124;
    fStack_120 = fStack_4e0 * auVar14._24_4_ * 3.0;
    auVar27._24_4_ = fStack_120;
    auVar27._28_4_ = auVar209._28_4_;
    auVar14 = vperm2f128_avx(auVar251,auVar251,1);
    auVar14 = vshufps_avx(auVar14,auVar251,0x30);
    auVar18 = vshufps_avx(auVar251,auVar14,0x29);
    auVar16 = vsubps_avx(auVar251,auVar26);
    auVar14 = vperm2f128_avx(auVar16,auVar16,1);
    auVar14 = vshufps_avx(auVar14,auVar16,0x30);
    auVar14 = vshufps_avx(auVar16,auVar14,0x29);
    auVar19 = vsubps_avx(auVar275,auVar27);
    auVar16 = vperm2f128_avx(auVar19,auVar19,1);
    auVar16 = vshufps_avx(auVar16,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar16,0x29);
    auVar21 = vsubps_avx(auVar251,local_98);
    auVar22 = vsubps_avx(auVar18,_local_3d8);
    fVar217 = auVar22._0_4_ + auVar21._0_4_;
    fVar210 = auVar22._4_4_ + auVar21._4_4_;
    fVar230 = auVar22._8_4_ + auVar21._8_4_;
    fVar211 = auVar22._12_4_ + auVar21._12_4_;
    fVar231 = auVar22._16_4_ + auVar21._16_4_;
    fVar212 = auVar22._20_4_ + auVar21._20_4_;
    fVar232 = auVar22._24_4_ + auVar21._24_4_;
    auVar16 = vperm2f128_avx(auVar168,auVar168,1);
    auVar16 = vshufps_avx(auVar16,auVar168,0x30);
    local_b8 = vshufps_avx(auVar168,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar275,auVar275,1);
    auVar16 = vshufps_avx(auVar16,auVar275,0x30);
    local_78 = vshufps_avx(auVar275,auVar16,0x29);
    auVar16 = vsubps_avx(auVar275,auVar168);
    auVar23 = vsubps_avx(local_78,local_b8);
    fVar213 = auVar23._0_4_ + auVar16._0_4_;
    fVar233 = auVar23._4_4_ + auVar16._4_4_;
    fVar214 = auVar23._8_4_ + auVar16._8_4_;
    fVar235 = auVar23._12_4_ + auVar16._12_4_;
    fVar191 = auVar23._16_4_ + auVar16._16_4_;
    fVar100 = auVar23._20_4_ + auVar16._20_4_;
    fVar101 = auVar23._24_4_ + auVar16._24_4_;
    auVar28._4_4_ = fVar210 * auVar168._4_4_;
    auVar28._0_4_ = fVar217 * auVar168._0_4_;
    auVar28._8_4_ = fVar230 * auVar168._8_4_;
    auVar28._12_4_ = fVar211 * auVar168._12_4_;
    auVar28._16_4_ = fVar231 * auVar168._16_4_;
    auVar28._20_4_ = fVar212 * auVar168._20_4_;
    auVar28._24_4_ = fVar232 * auVar168._24_4_;
    auVar28._28_4_ = auVar16._28_4_;
    auVar29._4_4_ = fVar233 * local_98._4_4_;
    auVar29._0_4_ = fVar213 * local_98._0_4_;
    auVar29._8_4_ = fVar214 * local_98._8_4_;
    auVar29._12_4_ = fVar235 * local_98._12_4_;
    auVar29._16_4_ = fVar191 * local_98._16_4_;
    auVar29._20_4_ = fVar100 * local_98._20_4_;
    auVar29._24_4_ = fVar101 * local_98._24_4_;
    auVar29._28_4_ = fVar312;
    auVar91 = vsubps_avx(auVar28,auVar29);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar17._28_4_;
    local_f8 = local_f8 + auVar168._0_4_;
    fStack_f4 = fStack_f4 + auVar168._4_4_;
    fStack_f0 = fStack_f0 + auVar168._8_4_;
    fStack_ec = fStack_ec + auVar168._12_4_;
    fStack_e8 = fStack_e8 + auVar168._16_4_;
    fStack_e4 = fStack_e4 + auVar168._20_4_;
    fStack_e0 = fStack_e0 + auVar168._24_4_;
    fStack_dc = fVar315 + auVar168._28_4_;
    auVar30._4_4_ = fVar210 * fStack_f4;
    auVar30._0_4_ = fVar217 * local_f8;
    auVar30._8_4_ = fVar230 * fStack_f0;
    auVar30._12_4_ = fVar211 * fStack_ec;
    auVar30._16_4_ = fVar231 * fStack_e8;
    auVar30._20_4_ = fVar212 * fStack_e4;
    auVar30._24_4_ = fVar232 * fStack_e0;
    auVar30._28_4_ = fVar315;
    auVar31._4_4_ = fVar233 * fStack_d4;
    auVar31._0_4_ = fVar213 * local_d8;
    auVar31._8_4_ = fVar214 * fStack_d0;
    auVar31._12_4_ = fVar235 * fStack_cc;
    auVar31._16_4_ = fVar191 * fStack_c8;
    auVar31._20_4_ = fVar100 * fStack_c4;
    auVar31._24_4_ = fVar101 * fStack_c0;
    auVar31._28_4_ = fVar315 + auVar168._28_4_;
    auVar17 = vsubps_avx(auVar30,auVar31);
    local_4c8 = auVar15._0_4_;
    fStack_4c4 = auVar15._4_4_;
    fStack_4c0 = auVar15._8_4_;
    fStack_4bc = auVar15._12_4_;
    fStack_4b8 = auVar15._16_4_;
    fStack_4b4 = auVar15._20_4_;
    fStack_4b0 = auVar15._24_4_;
    auVar32._4_4_ = fVar210 * fStack_4c4;
    auVar32._0_4_ = fVar217 * local_4c8;
    auVar32._8_4_ = fVar230 * fStack_4c0;
    auVar32._12_4_ = fVar211 * fStack_4bc;
    auVar32._16_4_ = fVar231 * fStack_4b8;
    auVar32._20_4_ = fVar212 * fStack_4b4;
    auVar32._24_4_ = fVar232 * fStack_4b0;
    auVar32._28_4_ = fVar315;
    local_488._0_4_ = auVar90._0_4_;
    local_488._4_4_ = auVar90._4_4_;
    fStack_480 = auVar90._8_4_;
    fStack_47c = auVar90._12_4_;
    fStack_478 = auVar90._16_4_;
    fStack_474 = auVar90._20_4_;
    fStack_470 = auVar90._24_4_;
    auVar33._4_4_ = fVar233 * (float)local_488._4_4_;
    auVar33._0_4_ = fVar213 * (float)local_488._0_4_;
    auVar33._8_4_ = fVar214 * fStack_480;
    auVar33._12_4_ = fVar235 * fStack_47c;
    auVar33._16_4_ = fVar191 * fStack_478;
    auVar33._20_4_ = fVar100 * fStack_474;
    auVar33._24_4_ = fVar101 * fStack_470;
    auVar33._28_4_ = local_98._28_4_;
    auVar92 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_b8._4_4_ * fVar210;
    auVar34._0_4_ = local_b8._0_4_ * fVar217;
    auVar34._8_4_ = local_b8._8_4_ * fVar230;
    auVar34._12_4_ = local_b8._12_4_ * fVar211;
    auVar34._16_4_ = local_b8._16_4_ * fVar231;
    auVar34._20_4_ = local_b8._20_4_ * fVar212;
    auVar34._24_4_ = local_b8._24_4_ * fVar232;
    auVar34._28_4_ = fVar315;
    auVar35._4_4_ = local_3d8._4_4_ * fVar233;
    auVar35._0_4_ = local_3d8._0_4_ * fVar213;
    auVar35._8_4_ = local_3d8._8_4_ * fVar214;
    auVar35._12_4_ = local_3d8._12_4_ * fVar235;
    auVar35._16_4_ = local_3d8._16_4_ * fVar191;
    auVar35._20_4_ = local_3d8._20_4_ * fVar100;
    auVar35._24_4_ = local_3d8._24_4_ * fVar101;
    auVar35._28_4_ = local_b8._28_4_;
    local_4e8 = auVar14._0_4_;
    fStack_4e4 = auVar14._4_4_;
    fStack_4e0 = auVar14._8_4_;
    fStack_4dc = auVar14._12_4_;
    fStack_4d8 = auVar14._16_4_;
    fStack_4d4 = auVar14._20_4_;
    fStack_4d0 = auVar14._24_4_;
    auVar125 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar275._4_4_ * fVar210;
    auVar36._0_4_ = auVar275._0_4_ * fVar217;
    auVar36._8_4_ = auVar275._8_4_ * fVar230;
    auVar36._12_4_ = auVar275._12_4_ * fVar211;
    auVar36._16_4_ = auVar275._16_4_ * fVar231;
    auVar36._20_4_ = auVar275._20_4_ * fVar212;
    auVar36._24_4_ = auVar275._24_4_ * fVar232;
    auVar36._28_4_ = fVar315;
    auVar37._4_4_ = fVar233 * auVar251._4_4_;
    auVar37._0_4_ = fVar213 * auVar251._0_4_;
    auVar37._8_4_ = fVar214 * auVar251._8_4_;
    auVar37._12_4_ = fVar235 * auVar251._12_4_;
    auVar37._16_4_ = fVar191 * auVar251._16_4_;
    auVar37._20_4_ = fVar100 * auVar251._20_4_;
    auVar37._24_4_ = fVar101 * auVar251._24_4_;
    auVar37._28_4_ = fStack_bc;
    auVar126 = vsubps_avx(auVar36,auVar37);
    local_118 = auVar251._0_4_ + local_118;
    fStack_114 = auVar251._4_4_ + fStack_114;
    fStack_110 = auVar251._8_4_ + fStack_110;
    fStack_10c = auVar251._12_4_ + fStack_10c;
    fStack_108 = auVar251._16_4_ + fStack_108;
    fStack_104 = auVar251._20_4_ + fStack_104;
    fStack_100 = auVar251._24_4_ + fStack_100;
    fStack_fc = auVar251._28_4_ + auVar20._28_4_;
    local_138 = auVar275._0_4_ + local_138;
    fStack_134 = auVar275._4_4_ + fStack_134;
    fStack_130 = auVar275._8_4_ + fStack_130;
    fStack_12c = auVar275._12_4_ + fStack_12c;
    fStack_128 = auVar275._16_4_ + fStack_128;
    fStack_124 = auVar275._20_4_ + fStack_124;
    fStack_120 = auVar275._24_4_ + fStack_120;
    fStack_11c = auVar275._28_4_ + auVar209._28_4_;
    auVar38._4_4_ = fVar210 * fStack_134;
    auVar38._0_4_ = fVar217 * local_138;
    auVar38._8_4_ = fVar230 * fStack_130;
    auVar38._12_4_ = fVar211 * fStack_12c;
    auVar38._16_4_ = fVar231 * fStack_128;
    auVar38._20_4_ = fVar212 * fStack_124;
    auVar38._24_4_ = fVar232 * fStack_120;
    auVar38._28_4_ = auVar275._28_4_ + auVar209._28_4_;
    auVar39._4_4_ = fStack_114 * fVar233;
    auVar39._0_4_ = local_118 * fVar213;
    auVar39._8_4_ = fStack_110 * fVar214;
    auVar39._12_4_ = fStack_10c * fVar235;
    auVar39._16_4_ = fStack_108 * fVar191;
    auVar39._20_4_ = fStack_104 * fVar100;
    auVar39._24_4_ = fStack_100 * fVar101;
    auVar39._28_4_ = fStack_fc;
    auVar20 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar210 * auVar19._4_4_;
    auVar40._0_4_ = fVar217 * auVar19._0_4_;
    auVar40._8_4_ = fVar230 * auVar19._8_4_;
    auVar40._12_4_ = fVar211 * auVar19._12_4_;
    auVar40._16_4_ = fVar231 * auVar19._16_4_;
    auVar40._20_4_ = fVar212 * auVar19._20_4_;
    auVar40._24_4_ = fVar232 * auVar19._24_4_;
    auVar40._28_4_ = fStack_fc;
    auVar41._4_4_ = fVar233 * fStack_4e4;
    auVar41._0_4_ = fVar213 * local_4e8;
    auVar41._8_4_ = fVar214 * fStack_4e0;
    auVar41._12_4_ = fVar235 * fStack_4dc;
    auVar41._16_4_ = fVar191 * fStack_4d8;
    auVar41._20_4_ = fVar100 * fStack_4d4;
    auVar41._24_4_ = fVar101 * fStack_4d0;
    auVar41._28_4_ = auVar19._28_4_;
    auVar127 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = fVar210 * local_78._4_4_;
    auVar42._0_4_ = fVar217 * local_78._0_4_;
    auVar42._8_4_ = fVar230 * local_78._8_4_;
    auVar42._12_4_ = fVar211 * local_78._12_4_;
    auVar42._16_4_ = fVar231 * local_78._16_4_;
    auVar42._20_4_ = fVar212 * local_78._20_4_;
    auVar42._24_4_ = fVar232 * local_78._24_4_;
    auVar42._28_4_ = auVar22._28_4_ + auVar21._28_4_;
    auVar43._4_4_ = auVar18._4_4_ * fVar233;
    auVar43._0_4_ = auVar18._0_4_ * fVar213;
    auVar43._8_4_ = auVar18._8_4_ * fVar214;
    auVar43._12_4_ = auVar18._12_4_ * fVar235;
    auVar43._16_4_ = auVar18._16_4_ * fVar191;
    auVar43._20_4_ = auVar18._20_4_ * fVar100;
    auVar43._24_4_ = auVar18._24_4_ * fVar101;
    auVar43._28_4_ = auVar23._28_4_ + auVar16._28_4_;
    auVar21 = vsubps_avx(auVar42,auVar43);
    auVar14 = vminps_avx(auVar91,auVar17);
    auVar90 = vmaxps_avx(auVar91,auVar17);
    auVar15 = vminps_avx(auVar92,auVar125);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar92,auVar125);
    auVar90 = vmaxps_avx(auVar90,auVar14);
    auVar16 = vminps_avx(auVar126,auVar20);
    auVar14 = vmaxps_avx(auVar126,auVar20);
    auVar17 = vminps_avx(auVar127,auVar21);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar15,auVar17);
    auVar15 = vmaxps_avx(auVar127,auVar21);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar90,auVar14);
    auVar90 = vcmpps_avx(auVar17,local_248,2);
    auVar14 = vcmpps_avx(auVar14,local_268,5);
    auVar90 = vandps_avx(auVar14,auVar90);
    auVar14 = local_158 & auVar90;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(_local_3d8,local_98);
      auVar15 = vsubps_avx(auVar18,auVar251);
      fVar210 = auVar14._0_4_ + auVar15._0_4_;
      fVar230 = auVar14._4_4_ + auVar15._4_4_;
      fVar211 = auVar14._8_4_ + auVar15._8_4_;
      fVar231 = auVar14._12_4_ + auVar15._12_4_;
      fVar212 = auVar14._16_4_ + auVar15._16_4_;
      fVar232 = auVar14._20_4_ + auVar15._20_4_;
      fVar213 = auVar14._24_4_ + auVar15._24_4_;
      auVar17 = vsubps_avx(local_b8,auVar168);
      auVar20 = vsubps_avx(local_78,auVar275);
      fVar233 = auVar17._0_4_ + auVar20._0_4_;
      fVar214 = auVar17._4_4_ + auVar20._4_4_;
      fVar235 = auVar17._8_4_ + auVar20._8_4_;
      fVar191 = auVar17._12_4_ + auVar20._12_4_;
      fVar100 = auVar17._16_4_ + auVar20._16_4_;
      fVar101 = auVar17._20_4_ + auVar20._20_4_;
      fVar102 = auVar17._24_4_ + auVar20._24_4_;
      fVar217 = auVar20._28_4_;
      auVar44._4_4_ = auVar168._4_4_ * fVar230;
      auVar44._0_4_ = auVar168._0_4_ * fVar210;
      auVar44._8_4_ = auVar168._8_4_ * fVar211;
      auVar44._12_4_ = auVar168._12_4_ * fVar231;
      auVar44._16_4_ = auVar168._16_4_ * fVar212;
      auVar44._20_4_ = auVar168._20_4_ * fVar232;
      auVar44._24_4_ = auVar168._24_4_ * fVar213;
      auVar44._28_4_ = auVar168._28_4_;
      auVar45._4_4_ = local_98._4_4_ * fVar214;
      auVar45._0_4_ = local_98._0_4_ * fVar233;
      auVar45._8_4_ = local_98._8_4_ * fVar235;
      auVar45._12_4_ = local_98._12_4_ * fVar191;
      auVar45._16_4_ = local_98._16_4_ * fVar100;
      auVar45._20_4_ = local_98._20_4_ * fVar101;
      auVar45._24_4_ = local_98._24_4_ * fVar102;
      auVar45._28_4_ = local_98._28_4_;
      auVar20 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar230 * fStack_f4;
      auVar46._0_4_ = fVar210 * local_f8;
      auVar46._8_4_ = fVar211 * fStack_f0;
      auVar46._12_4_ = fVar231 * fStack_ec;
      auVar46._16_4_ = fVar212 * fStack_e8;
      auVar46._20_4_ = fVar232 * fStack_e4;
      auVar46._24_4_ = fVar213 * fStack_e0;
      auVar46._28_4_ = auVar168._28_4_;
      auVar47._4_4_ = fVar214 * fStack_d4;
      auVar47._0_4_ = fVar233 * local_d8;
      auVar47._8_4_ = fVar235 * fStack_d0;
      auVar47._12_4_ = fVar191 * fStack_cc;
      auVar47._16_4_ = fVar100 * fStack_c8;
      auVar47._20_4_ = fVar101 * fStack_c4;
      auVar47._24_4_ = fVar102 * fStack_c0;
      auVar47._28_4_ = fVar217;
      auVar21 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar230 * fStack_4c4;
      auVar48._0_4_ = fVar210 * local_4c8;
      auVar48._8_4_ = fVar211 * fStack_4c0;
      auVar48._12_4_ = fVar231 * fStack_4bc;
      auVar48._16_4_ = fVar212 * fStack_4b8;
      auVar48._20_4_ = fVar232 * fStack_4b4;
      auVar48._24_4_ = fVar213 * fStack_4b0;
      auVar48._28_4_ = fVar217;
      auVar49._4_4_ = fVar214 * (float)local_488._4_4_;
      auVar49._0_4_ = fVar233 * (float)local_488._0_4_;
      auVar49._8_4_ = fVar235 * fStack_480;
      auVar49._12_4_ = fVar191 * fStack_47c;
      auVar49._16_4_ = fVar100 * fStack_478;
      auVar49._20_4_ = fVar101 * fStack_474;
      auVar49._24_4_ = fVar102 * fStack_470;
      auVar49._28_4_ = auVar16._28_4_;
      auVar22 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_b8._4_4_ * fVar230;
      auVar50._0_4_ = local_b8._0_4_ * fVar210;
      auVar50._8_4_ = local_b8._8_4_ * fVar211;
      auVar50._12_4_ = local_b8._12_4_ * fVar231;
      auVar50._16_4_ = local_b8._16_4_ * fVar212;
      auVar50._20_4_ = local_b8._20_4_ * fVar232;
      auVar50._24_4_ = local_b8._24_4_ * fVar213;
      auVar50._28_4_ = auVar16._28_4_;
      auVar51._4_4_ = local_3d8._4_4_ * fVar214;
      auVar51._0_4_ = local_3d8._0_4_ * fVar233;
      auVar51._8_4_ = local_3d8._8_4_ * fVar235;
      auVar51._12_4_ = local_3d8._12_4_ * fVar191;
      auVar51._16_4_ = local_3d8._16_4_ * fVar100;
      auVar51._20_4_ = local_3d8._20_4_ * fVar101;
      uVar2 = local_3d8._28_4_;
      auVar51._24_4_ = local_3d8._24_4_ * fVar102;
      auVar51._28_4_ = uVar2;
      auVar23 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar275._4_4_ * fVar230;
      auVar52._0_4_ = auVar275._0_4_ * fVar210;
      auVar52._8_4_ = auVar275._8_4_ * fVar211;
      auVar52._12_4_ = auVar275._12_4_ * fVar231;
      auVar52._16_4_ = auVar275._16_4_ * fVar212;
      auVar52._20_4_ = auVar275._20_4_ * fVar232;
      auVar52._24_4_ = auVar275._24_4_ * fVar213;
      auVar52._28_4_ = uVar2;
      auVar53._4_4_ = auVar251._4_4_ * fVar214;
      auVar53._0_4_ = auVar251._0_4_ * fVar233;
      auVar53._8_4_ = auVar251._8_4_ * fVar235;
      auVar53._12_4_ = auVar251._12_4_ * fVar191;
      auVar53._16_4_ = auVar251._16_4_ * fVar100;
      auVar53._20_4_ = auVar251._20_4_ * fVar101;
      auVar53._24_4_ = auVar251._24_4_ * fVar102;
      auVar53._28_4_ = auVar251._28_4_;
      auVar91 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar230 * fStack_134;
      auVar54._0_4_ = fVar210 * local_138;
      auVar54._8_4_ = fVar211 * fStack_130;
      auVar54._12_4_ = fVar231 * fStack_12c;
      auVar54._16_4_ = fVar212 * fStack_128;
      auVar54._20_4_ = fVar232 * fStack_124;
      auVar54._24_4_ = fVar213 * fStack_120;
      auVar54._28_4_ = uVar2;
      auVar55._4_4_ = fVar214 * fStack_114;
      auVar55._0_4_ = fVar233 * local_118;
      auVar55._8_4_ = fVar235 * fStack_110;
      auVar55._12_4_ = fVar191 * fStack_10c;
      auVar55._16_4_ = fVar100 * fStack_108;
      auVar55._20_4_ = fVar101 * fStack_104;
      auVar55._24_4_ = fVar102 * fStack_100;
      auVar55._28_4_ = auVar275._28_4_;
      auVar92 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar230 * auVar19._4_4_;
      auVar56._0_4_ = fVar210 * auVar19._0_4_;
      auVar56._8_4_ = fVar211 * auVar19._8_4_;
      auVar56._12_4_ = fVar231 * auVar19._12_4_;
      auVar56._16_4_ = fVar212 * auVar19._16_4_;
      auVar56._20_4_ = fVar232 * auVar19._20_4_;
      auVar56._24_4_ = fVar213 * auVar19._24_4_;
      auVar56._28_4_ = auVar275._28_4_;
      auVar57._4_4_ = fStack_4e4 * fVar214;
      auVar57._0_4_ = local_4e8 * fVar233;
      auVar57._8_4_ = fStack_4e0 * fVar235;
      auVar57._12_4_ = fStack_4dc * fVar191;
      auVar57._16_4_ = fStack_4d8 * fVar100;
      auVar57._20_4_ = fStack_4d4 * fVar101;
      auVar57._24_4_ = fStack_4d0 * fVar102;
      auVar57._28_4_ = local_b8._28_4_;
      auVar19 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = local_78._4_4_ * fVar230;
      auVar58._0_4_ = local_78._0_4_ * fVar210;
      auVar58._8_4_ = local_78._8_4_ * fVar211;
      auVar58._12_4_ = local_78._12_4_ * fVar231;
      auVar58._16_4_ = local_78._16_4_ * fVar212;
      auVar58._20_4_ = local_78._20_4_ * fVar232;
      auVar58._24_4_ = local_78._24_4_ * fVar213;
      auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar59._4_4_ = auVar18._4_4_ * fVar214;
      auVar59._0_4_ = auVar18._0_4_ * fVar233;
      auVar59._8_4_ = auVar18._8_4_ * fVar235;
      auVar59._12_4_ = auVar18._12_4_ * fVar191;
      auVar59._16_4_ = auVar18._16_4_ * fVar100;
      auVar59._20_4_ = auVar18._20_4_ * fVar101;
      auVar59._24_4_ = auVar18._24_4_ * fVar102;
      auVar59._28_4_ = auVar17._28_4_ + fVar217;
      auVar125 = vsubps_avx(auVar58,auVar59);
      auVar15 = vminps_avx(auVar20,auVar21);
      auVar14 = vmaxps_avx(auVar20,auVar21);
      auVar16 = vminps_avx(auVar22,auVar23);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar22,auVar23);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar91,auVar92);
      auVar15 = vmaxps_avx(auVar91,auVar92);
      auVar18 = vminps_avx(auVar19,auVar125);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar19,auVar125);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_248,2);
      auVar15 = vcmpps_avx(auVar15,local_268,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar90 = vandps_avx(local_158,auVar90);
      auVar15 = auVar90 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar90 = vandps_avx(auVar14,auVar90);
        uVar68 = vmovmskps_avx(auVar90);
        if (uVar68 != 0) {
          uVar65 = (ulong)uVar67;
          auStack_3b8[uVar65] = uVar68 & 0xff;
          uVar3 = vmovlps_avx(auVar133);
          *(undefined8 *)(afStack_228 + uVar65 * 2) = uVar3;
          uVar69 = vmovlps_avx(auVar104);
          auStack_58[uVar65] = uVar69;
          uVar67 = uVar67 + 1;
        }
      }
    }
    if (uVar67 != 0) {
      do {
        uVar65 = (ulong)(uVar67 - 1);
        uVar68 = auStack_3b8[uVar65];
        fVar217 = afStack_228[uVar65 * 2];
        fVar210 = afStack_228[uVar65 * 2 + 1];
        auVar294._8_8_ = 0;
        auVar294._0_8_ = auStack_58[uVar65];
        auVar302 = ZEXT1664(auVar294);
        uVar69 = 0;
        if (uVar68 != 0) {
          for (; (uVar68 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
          }
        }
        uVar68 = uVar68 - 1 & uVar68;
        auStack_3b8[uVar65] = uVar68;
        if (uVar68 == 0) {
          uVar67 = uVar67 - 1;
        }
        fVar211 = (float)(uVar69 + 1) * 0.14285715;
        fVar230 = (1.0 - (float)uVar69 * 0.14285715) * fVar217 +
                  fVar210 * (float)uVar69 * 0.14285715;
        fVar217 = (1.0 - fVar211) * fVar217 + fVar210 * fVar211;
        fVar210 = fVar217 - fVar230;
        if (0.16666667 <= fVar210) {
          auVar78 = vinsertps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar217),0x10);
          auVar308 = ZEXT1664(auVar78);
          goto LAB_010361ca;
        }
        auVar78 = vshufps_avx(auVar294,auVar294,0x50);
        auVar107._8_4_ = 0x3f800000;
        auVar107._0_8_ = 0x3f8000003f800000;
        auVar107._12_4_ = 0x3f800000;
        auVar221 = vsubps_avx(auVar107,auVar78);
        fVar211 = auVar78._0_4_;
        fVar231 = auVar78._4_4_;
        fVar212 = auVar78._8_4_;
        fVar232 = auVar78._12_4_;
        fVar213 = auVar221._0_4_;
        fVar233 = auVar221._4_4_;
        fVar214 = auVar221._8_4_;
        fVar235 = auVar221._12_4_;
        auVar137._0_4_ = fVar211 * auVar318._0_4_ + fVar213 * fVar187;
        auVar137._4_4_ = fVar231 * auVar318._4_4_ + fVar233 * fVar189;
        auVar137._8_4_ = fVar212 * auVar318._0_4_ + fVar214 * fVar187;
        auVar137._12_4_ = fVar232 * auVar318._4_4_ + fVar235 * fVar189;
        auVar173._0_4_ = fVar211 * auVar283._0_4_ + fVar213 * fVar188;
        auVar173._4_4_ = fVar231 * auVar283._4_4_ + fVar233 * fVar190;
        auVar173._8_4_ = fVar212 * auVar283._0_4_ + fVar214 * fVar188;
        auVar173._12_4_ = fVar232 * auVar283._4_4_ + fVar235 * fVar190;
        auVar200._0_4_ = fVar211 * auVar106._0_4_ + auVar330._0_4_ * fVar213;
        auVar200._4_4_ = fVar231 * auVar106._4_4_ + auVar330._4_4_ * fVar233;
        auVar200._8_4_ = fVar212 * auVar106._0_4_ + auVar330._0_4_ * fVar214;
        auVar200._12_4_ = fVar232 * auVar106._4_4_ + auVar330._4_4_ * fVar235;
        auVar75._0_4_ = auVar73._0_4_ * fVar211 + auVar323._0_4_ * fVar213;
        auVar75._4_4_ = auVar73._4_4_ * fVar231 + auVar323._4_4_ * fVar233;
        auVar75._8_4_ = auVar73._0_4_ * fVar212 + auVar323._0_4_ * fVar214;
        auVar75._12_4_ = auVar73._4_4_ * fVar232 + auVar323._4_4_ * fVar235;
        auVar130._16_16_ = auVar137;
        auVar130._0_16_ = auVar137;
        auVar157._16_16_ = auVar173;
        auVar157._0_16_ = auVar173;
        auVar185._16_16_ = auVar200;
        auVar185._0_16_ = auVar200;
        _local_488 = ZEXT432((uint)fVar230);
        auVar90 = ZEXT2032(CONCAT416(fVar217,ZEXT416((uint)fVar230)));
        auVar90 = vshufps_avx(auVar90,auVar90,0);
        auVar14 = vsubps_avx(auVar157,auVar130);
        fVar211 = auVar90._0_4_;
        fVar231 = auVar90._4_4_;
        fVar212 = auVar90._8_4_;
        fVar232 = auVar90._12_4_;
        fVar213 = auVar90._16_4_;
        fVar233 = auVar90._20_4_;
        fVar214 = auVar90._24_4_;
        auVar131._0_4_ = auVar137._0_4_ + auVar14._0_4_ * fVar211;
        auVar131._4_4_ = auVar137._4_4_ + auVar14._4_4_ * fVar231;
        auVar131._8_4_ = auVar137._8_4_ + auVar14._8_4_ * fVar212;
        auVar131._12_4_ = auVar137._12_4_ + auVar14._12_4_ * fVar232;
        auVar131._16_4_ = auVar137._0_4_ + auVar14._16_4_ * fVar213;
        auVar131._20_4_ = auVar137._4_4_ + auVar14._20_4_ * fVar233;
        auVar131._24_4_ = auVar137._8_4_ + auVar14._24_4_ * fVar214;
        auVar131._28_4_ = auVar137._12_4_ + auVar14._28_4_;
        auVar90 = vsubps_avx(auVar185,auVar157);
        auVar158._0_4_ = auVar173._0_4_ + auVar90._0_4_ * fVar211;
        auVar158._4_4_ = auVar173._4_4_ + auVar90._4_4_ * fVar231;
        auVar158._8_4_ = auVar173._8_4_ + auVar90._8_4_ * fVar212;
        auVar158._12_4_ = auVar173._12_4_ + auVar90._12_4_ * fVar232;
        auVar158._16_4_ = auVar173._0_4_ + auVar90._16_4_ * fVar213;
        auVar158._20_4_ = auVar173._4_4_ + auVar90._20_4_ * fVar233;
        auVar158._24_4_ = auVar173._8_4_ + auVar90._24_4_ * fVar214;
        auVar158._28_4_ = auVar173._12_4_ + auVar90._28_4_;
        auVar78 = vsubps_avx(auVar75,auVar200);
        auVar97._0_4_ = auVar200._0_4_ + auVar78._0_4_ * fVar211;
        auVar97._4_4_ = auVar200._4_4_ + auVar78._4_4_ * fVar231;
        auVar97._8_4_ = auVar200._8_4_ + auVar78._8_4_ * fVar212;
        auVar97._12_4_ = auVar200._12_4_ + auVar78._12_4_ * fVar232;
        auVar97._16_4_ = auVar200._0_4_ + auVar78._0_4_ * fVar213;
        auVar97._20_4_ = auVar200._4_4_ + auVar78._4_4_ * fVar233;
        auVar97._24_4_ = auVar200._8_4_ + auVar78._8_4_ * fVar214;
        auVar97._28_4_ = auVar200._12_4_ + auVar78._12_4_;
        auVar90 = vsubps_avx(auVar158,auVar131);
        auVar132._0_4_ = auVar131._0_4_ + fVar211 * auVar90._0_4_;
        auVar132._4_4_ = auVar131._4_4_ + fVar231 * auVar90._4_4_;
        auVar132._8_4_ = auVar131._8_4_ + fVar212 * auVar90._8_4_;
        auVar132._12_4_ = auVar131._12_4_ + fVar232 * auVar90._12_4_;
        auVar132._16_4_ = auVar131._16_4_ + fVar213 * auVar90._16_4_;
        auVar132._20_4_ = auVar131._20_4_ + fVar233 * auVar90._20_4_;
        auVar132._24_4_ = auVar131._24_4_ + fVar214 * auVar90._24_4_;
        auVar132._28_4_ = auVar131._28_4_ + auVar90._28_4_;
        auVar90 = vsubps_avx(auVar97,auVar158);
        auVar98._0_4_ = auVar158._0_4_ + fVar211 * auVar90._0_4_;
        auVar98._4_4_ = auVar158._4_4_ + fVar231 * auVar90._4_4_;
        auVar98._8_4_ = auVar158._8_4_ + fVar212 * auVar90._8_4_;
        auVar98._12_4_ = auVar158._12_4_ + fVar232 * auVar90._12_4_;
        auVar98._16_4_ = auVar158._16_4_ + fVar213 * auVar90._16_4_;
        auVar98._20_4_ = auVar158._20_4_ + fVar233 * auVar90._20_4_;
        auVar98._24_4_ = auVar158._24_4_ + fVar214 * auVar90._24_4_;
        auVar98._28_4_ = auVar158._28_4_ + auVar90._28_4_;
        auVar90 = vsubps_avx(auVar98,auVar132);
        auVar224._0_4_ = auVar132._0_4_ + fVar211 * auVar90._0_4_;
        auVar224._4_4_ = auVar132._4_4_ + fVar231 * auVar90._4_4_;
        auVar224._8_4_ = auVar132._8_4_ + fVar212 * auVar90._8_4_;
        auVar224._12_4_ = auVar132._12_4_ + fVar232 * auVar90._12_4_;
        auVar229._16_4_ = auVar132._16_4_ + fVar213 * auVar90._16_4_;
        auVar229._0_16_ = auVar224;
        auVar229._20_4_ = auVar132._20_4_ + fVar233 * auVar90._20_4_;
        auVar229._24_4_ = auVar132._24_4_ + fVar214 * auVar90._24_4_;
        auVar229._28_4_ = auVar132._28_4_ + auVar158._28_4_;
        auVar234 = auVar229._16_16_;
        auVar109 = vshufps_avx(ZEXT416((uint)(fVar210 * 0.33333334)),
                               ZEXT416((uint)(fVar210 * 0.33333334)),0);
        auVar174._0_4_ = auVar224._0_4_ + auVar109._0_4_ * auVar90._0_4_ * 3.0;
        auVar174._4_4_ = auVar224._4_4_ + auVar109._4_4_ * auVar90._4_4_ * 3.0;
        auVar174._8_4_ = auVar224._8_4_ + auVar109._8_4_ * auVar90._8_4_ * 3.0;
        auVar174._12_4_ = auVar224._12_4_ + auVar109._12_4_ * auVar90._12_4_ * 3.0;
        auVar153 = vshufpd_avx(auVar224,auVar224,3);
        auVar121 = vshufpd_avx(auVar234,auVar234,3);
        _local_3d8 = auVar153;
        auVar78 = vsubps_avx(auVar153,auVar224);
        auVar221 = vsubps_avx(auVar121,auVar234);
        auVar76._0_4_ = auVar78._0_4_ + auVar221._0_4_;
        auVar76._4_4_ = auVar78._4_4_ + auVar221._4_4_;
        auVar76._8_4_ = auVar78._8_4_ + auVar221._8_4_;
        auVar76._12_4_ = auVar78._12_4_ + auVar221._12_4_;
        auVar78 = vmovshdup_avx(auVar224);
        auVar221 = vmovshdup_avx(auVar174);
        auVar139 = vshufps_avx(auVar76,auVar76,0);
        auVar110 = vshufps_avx(auVar76,auVar76,0x55);
        fVar211 = auVar110._0_4_;
        fVar231 = auVar110._4_4_;
        fVar212 = auVar110._8_4_;
        fVar232 = auVar110._12_4_;
        fVar213 = auVar139._0_4_;
        fVar233 = auVar139._4_4_;
        fVar214 = auVar139._8_4_;
        fVar235 = auVar139._12_4_;
        auVar77._0_4_ = fVar213 * auVar224._0_4_ + auVar78._0_4_ * fVar211;
        auVar77._4_4_ = fVar233 * auVar224._4_4_ + auVar78._4_4_ * fVar231;
        auVar77._8_4_ = fVar214 * auVar224._8_4_ + auVar78._8_4_ * fVar212;
        auVar77._12_4_ = fVar235 * auVar224._12_4_ + auVar78._12_4_ * fVar232;
        auVar295._0_4_ = fVar213 * auVar174._0_4_ + auVar221._0_4_ * fVar211;
        auVar295._4_4_ = fVar233 * auVar174._4_4_ + auVar221._4_4_ * fVar231;
        auVar295._8_4_ = fVar214 * auVar174._8_4_ + auVar221._8_4_ * fVar212;
        auVar295._12_4_ = fVar235 * auVar174._12_4_ + auVar221._12_4_ * fVar232;
        auVar221 = vshufps_avx(auVar77,auVar77,0xe8);
        auVar139 = vshufps_avx(auVar295,auVar295,0xe8);
        auVar78 = vcmpps_avx(auVar221,auVar139,1);
        uVar68 = vextractps_avx(auVar78,0);
        auVar110 = auVar295;
        if ((uVar68 & 1) == 0) {
          auVar110 = auVar77;
        }
        auVar108._0_4_ = auVar109._0_4_ * auVar90._16_4_ * 3.0;
        auVar108._4_4_ = auVar109._4_4_ * auVar90._20_4_ * 3.0;
        auVar108._8_4_ = auVar109._8_4_ * auVar90._24_4_ * 3.0;
        auVar108._12_4_ = auVar109._12_4_ * 0.0;
        auVar103 = vsubps_avx(auVar234,auVar108);
        auVar109 = vmovshdup_avx(auVar103);
        auVar234 = vmovshdup_avx(auVar234);
        fVar191 = auVar103._0_4_;
        fVar100 = auVar103._4_4_;
        auVar201._0_4_ = fVar191 * fVar213 + auVar109._0_4_ * fVar211;
        auVar201._4_4_ = fVar100 * fVar233 + auVar109._4_4_ * fVar231;
        auVar201._8_4_ = auVar103._8_4_ * fVar214 + auVar109._8_4_ * fVar212;
        auVar201._12_4_ = auVar103._12_4_ * fVar235 + auVar109._12_4_ * fVar232;
        auVar331._0_4_ = fVar213 * auVar229._16_4_ + auVar234._0_4_ * fVar211;
        auVar331._4_4_ = fVar233 * auVar229._20_4_ + auVar234._4_4_ * fVar231;
        auVar331._8_4_ = fVar214 * auVar229._24_4_ + auVar234._8_4_ * fVar212;
        auVar331._12_4_ = fVar235 * auVar229._28_4_ + auVar234._12_4_ * fVar232;
        auVar234 = vshufps_avx(auVar201,auVar201,0xe8);
        auVar72 = vshufps_avx(auVar331,auVar331,0xe8);
        auVar109 = vcmpps_avx(auVar234,auVar72,1);
        uVar68 = vextractps_avx(auVar109,0);
        auVar104 = auVar331;
        if ((uVar68 & 1) == 0) {
          auVar104 = auVar201;
        }
        auVar110 = vmaxss_avx(auVar104,auVar110);
        auVar221 = vminps_avx(auVar221,auVar139);
        auVar139 = vminps_avx(auVar234,auVar72);
        auVar139 = vminps_avx(auVar221,auVar139);
        auVar78 = vshufps_avx(auVar78,auVar78,0x55);
        auVar78 = vblendps_avx(auVar78,auVar109,2);
        auVar109 = vpslld_avx(auVar78,0x1f);
        auVar78 = vshufpd_avx(auVar295,auVar295,1);
        auVar78 = vinsertps_avx(auVar78,auVar331,0x9c);
        auVar221 = vshufpd_avx(auVar77,auVar77,1);
        auVar221 = vinsertps_avx(auVar221,auVar201,0x9c);
        auVar78 = vblendvps_avx(auVar221,auVar78,auVar109);
        auVar221 = vmovshdup_avx(auVar78);
        auVar78 = vmaxss_avx(auVar221,auVar78);
        fVar212 = auVar139._0_4_;
        auVar221 = vmovshdup_avx(auVar139);
        fVar231 = auVar78._0_4_;
        fVar232 = auVar221._0_4_;
        fVar211 = auVar110._0_4_;
        if ((0.0001 <= fVar212) || (fVar231 <= -0.0001)) {
          if ((fVar232 < 0.0001 && -0.0001 < fVar211) || (fVar212 < 0.0001 && -0.0001 < fVar211))
          goto LAB_01036bcf;
          auVar109 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar78,1);
          auVar221 = vcmpps_avx(auVar221,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar221 = vandps_avx(auVar221,auVar109);
          if ((auVar221 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_01036bcf;
        }
        else {
LAB_01036bcf:
          auVar109 = vcmpps_avx(auVar139,_DAT_01f7aa10,1);
          auVar221 = vcmpss_avx(auVar110,ZEXT416(0) << 0x20,1);
          auVar138._8_4_ = 0x3f800000;
          auVar138._0_8_ = 0x3f8000003f800000;
          auVar138._12_4_ = 0x3f800000;
          auVar175._8_4_ = 0xbf800000;
          auVar175._0_8_ = 0xbf800000bf800000;
          auVar175._12_4_ = 0xbf800000;
          auVar221 = vblendvps_avx(auVar138,auVar175,auVar221);
          auVar109 = vblendvps_avx(auVar138,auVar175,auVar109);
          auVar139 = vcmpss_avx(auVar109,auVar221,4);
          auVar139 = vpshufd_avx(ZEXT416(auVar139._0_4_ & 1),0x50);
          auVar139 = vpslld_avx(auVar139,0x1f);
          auVar139 = vpsrad_avx(auVar139,0x1f);
          auVar139 = vpandn_avx(auVar139,_DAT_01fafeb0);
          auVar110 = vmovshdup_avx(auVar109);
          fVar213 = auVar110._0_4_;
          if ((auVar109._0_4_ != fVar213) || (NAN(auVar109._0_4_) || NAN(fVar213))) {
            if ((fVar232 != fVar212) || (NAN(fVar232) || NAN(fVar212))) {
              fVar212 = -fVar212 / (fVar232 - fVar212);
              auVar109 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar212) * 0.0 + fVar212)));
            }
            else {
              auVar109 = ZEXT816(0x3f80000000000000);
              if ((fVar212 != 0.0) || (NAN(fVar212))) {
                auVar109 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar234 = vcmpps_avx(auVar139,auVar109,1);
            auVar110 = vblendps_avx(auVar139,auVar109,2);
            auVar109 = vblendps_avx(auVar109,auVar139,2);
            auVar139 = vblendvps_avx(auVar109,auVar110,auVar234);
          }
          auVar78 = vcmpss_avx(auVar78,ZEXT416(0) << 0x20,1);
          auVar140._8_4_ = 0x3f800000;
          auVar140._0_8_ = 0x3f8000003f800000;
          auVar140._12_4_ = 0x3f800000;
          auVar176._8_4_ = 0xbf800000;
          auVar176._0_8_ = 0xbf800000bf800000;
          auVar176._12_4_ = 0xbf800000;
          auVar78 = vblendvps_avx(auVar140,auVar176,auVar78);
          fVar212 = auVar78._0_4_;
          if ((auVar221._0_4_ != fVar212) || (NAN(auVar221._0_4_) || NAN(fVar212))) {
            if ((fVar231 != fVar211) || (NAN(fVar231) || NAN(fVar211))) {
              fVar211 = -fVar211 / (fVar231 - fVar211);
              auVar78 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar211) * 0.0 + fVar211)));
            }
            else {
              auVar78 = ZEXT816(0x3f80000000000000);
              if ((fVar211 != 0.0) || (NAN(fVar211))) {
                auVar78 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar109 = vcmpps_avx(auVar139,auVar78,1);
            auVar221 = vblendps_avx(auVar139,auVar78,2);
            auVar78 = vblendps_avx(auVar78,auVar139,2);
            auVar139 = vblendvps_avx(auVar78,auVar221,auVar109);
          }
          if ((fVar213 != fVar212) || (NAN(fVar213) || NAN(fVar212))) {
            auVar79._8_4_ = 0x3f800000;
            auVar79._0_8_ = 0x3f8000003f800000;
            auVar79._12_4_ = 0x3f800000;
            auVar78 = vcmpps_avx(auVar139,auVar79,1);
            auVar221 = vinsertps_avx(auVar139,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar141._4_12_ = auVar139._4_12_;
            auVar141._0_4_ = 0x3f800000;
            auVar139 = vblendvps_avx(auVar141,auVar221,auVar78);
          }
          auVar78 = vcmpps_avx(auVar139,_DAT_01f7b6f0,1);
          auVar61._12_4_ = 0;
          auVar61._0_12_ = auVar139._4_12_;
          auVar221 = vinsertps_avx(auVar139,ZEXT416(0x3f800000),0x10);
          auVar78 = vblendvps_avx(auVar221,auVar61 << 0x20,auVar78);
          auVar221 = vmovshdup_avx(auVar78);
          if (auVar78._0_4_ <= auVar221._0_4_) {
            auVar80._0_4_ = auVar78._0_4_ + -0.1;
            auVar80._4_4_ = auVar78._4_4_ + 0.1;
            auVar80._8_4_ = auVar78._8_4_ + 0.0;
            auVar80._12_4_ = auVar78._12_4_ + 0.0;
            auVar109 = vshufpd_avx(auVar174,auVar174,3);
            auVar225._8_8_ = 0x3f80000000000000;
            auVar225._0_8_ = 0x3f80000000000000;
            auVar78 = vcmpps_avx(auVar80,auVar225,1);
            auVar60._12_4_ = 0;
            auVar60._0_12_ = auVar80._4_12_;
            auVar221 = vinsertps_avx(auVar80,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar78 = vblendvps_avx(auVar221,auVar60 << 0x20,auVar78);
            auVar221 = vshufpd_avx(auVar103,auVar103,3);
            auVar139 = vshufps_avx(auVar78,auVar78,0x50);
            auVar325._8_4_ = 0x3f800000;
            auVar325._0_8_ = 0x3f8000003f800000;
            auVar325._12_4_ = 0x3f800000;
            auVar110 = vsubps_avx(auVar325,auVar139);
            local_3d8._0_4_ = auVar153._0_4_;
            local_3d8._4_4_ = auVar153._4_4_;
            fStack_3d0 = auVar153._8_4_;
            fStack_3cc = auVar153._12_4_;
            fVar211 = auVar139._0_4_;
            fVar231 = auVar139._4_4_;
            fVar212 = auVar139._8_4_;
            fVar232 = auVar139._12_4_;
            local_568 = auVar121._0_4_;
            fStack_564 = auVar121._4_4_;
            fStack_560 = auVar121._8_4_;
            fStack_55c = auVar121._12_4_;
            fVar213 = auVar110._0_4_;
            fVar233 = auVar110._4_4_;
            fVar214 = auVar110._8_4_;
            fVar235 = auVar110._12_4_;
            auVar81._0_4_ = fVar211 * (float)local_3d8._0_4_ + fVar213 * auVar224._0_4_;
            auVar81._4_4_ = fVar231 * (float)local_3d8._4_4_ + fVar233 * auVar224._4_4_;
            auVar81._8_4_ = fVar212 * fStack_3d0 + fVar214 * auVar224._0_4_;
            auVar81._12_4_ = fVar232 * fStack_3cc + fVar235 * auVar224._4_4_;
            auVar202._0_4_ = auVar109._0_4_ * fVar211 + fVar213 * auVar174._0_4_;
            auVar202._4_4_ = auVar109._4_4_ * fVar231 + fVar233 * auVar174._4_4_;
            auVar202._8_4_ = auVar109._8_4_ * fVar212 + fVar214 * auVar174._0_4_;
            auVar202._12_4_ = auVar109._12_4_ * fVar232 + fVar235 * auVar174._4_4_;
            auVar243._0_4_ = auVar221._0_4_ * fVar211 + fVar213 * fVar191;
            auVar243._4_4_ = auVar221._4_4_ * fVar231 + fVar233 * fVar100;
            auVar243._8_4_ = auVar221._8_4_ * fVar212 + fVar214 * fVar191;
            auVar243._12_4_ = auVar221._12_4_ * fVar232 + fVar235 * fVar100;
            auVar284._0_4_ = fVar211 * local_568 + fVar213 * auVar229._16_4_;
            auVar284._4_4_ = fVar231 * fStack_564 + fVar233 * auVar229._20_4_;
            auVar284._8_4_ = fVar212 * fStack_560 + fVar214 * auVar229._16_4_;
            auVar284._12_4_ = fVar232 * fStack_55c + fVar235 * auVar229._20_4_;
            auVar121 = vsubps_avx(auVar325,auVar78);
            auVar221 = vmovshdup_avx(auVar294);
            auVar153 = vmovsldup_avx(auVar294);
            auVar332._0_4_ = auVar121._0_4_ * auVar153._0_4_ + auVar78._0_4_ * auVar221._0_4_;
            auVar332._4_4_ = auVar121._4_4_ * auVar153._4_4_ + auVar78._4_4_ * auVar221._4_4_;
            auVar332._8_4_ = auVar121._8_4_ * auVar153._8_4_ + auVar78._8_4_ * auVar221._8_4_;
            auVar332._12_4_ = auVar121._12_4_ * auVar153._12_4_ + auVar78._12_4_ * auVar221._12_4_;
            auVar103 = vmovshdup_avx(auVar332);
            auVar78 = vsubps_avx(auVar202,auVar81);
            auVar142._0_4_ = auVar78._0_4_ * 3.0;
            auVar142._4_4_ = auVar78._4_4_ * 3.0;
            auVar142._8_4_ = auVar78._8_4_ * 3.0;
            auVar142._12_4_ = auVar78._12_4_ * 3.0;
            auVar78 = vsubps_avx(auVar243,auVar202);
            auVar161._0_4_ = auVar78._0_4_ * 3.0;
            auVar161._4_4_ = auVar78._4_4_ * 3.0;
            auVar161._8_4_ = auVar78._8_4_ * 3.0;
            auVar161._12_4_ = auVar78._12_4_ * 3.0;
            auVar78 = vsubps_avx(auVar284,auVar243);
            auVar256._0_4_ = auVar78._0_4_ * 3.0;
            auVar256._4_4_ = auVar78._4_4_ * 3.0;
            auVar256._8_4_ = auVar78._8_4_ * 3.0;
            auVar256._12_4_ = auVar78._12_4_ * 3.0;
            auVar221 = vminps_avx(auVar161,auVar256);
            auVar78 = vmaxps_avx(auVar161,auVar256);
            auVar221 = vminps_avx(auVar142,auVar221);
            auVar78 = vmaxps_avx(auVar142,auVar78);
            auVar153 = vshufpd_avx(auVar221,auVar221,3);
            auVar121 = vshufpd_avx(auVar78,auVar78,3);
            auVar221 = vminps_avx(auVar221,auVar153);
            auVar78 = vmaxps_avx(auVar78,auVar121);
            auVar153 = vshufps_avx(ZEXT416((uint)(1.0 / fVar210)),ZEXT416((uint)(1.0 / fVar210)),0);
            auVar257._0_4_ = auVar153._0_4_ * auVar221._0_4_;
            auVar257._4_4_ = auVar153._4_4_ * auVar221._4_4_;
            auVar257._8_4_ = auVar153._8_4_ * auVar221._8_4_;
            auVar257._12_4_ = auVar153._12_4_ * auVar221._12_4_;
            auVar270._0_4_ = auVar153._0_4_ * auVar78._0_4_;
            auVar270._4_4_ = auVar153._4_4_ * auVar78._4_4_;
            auVar270._8_4_ = auVar153._8_4_ * auVar78._8_4_;
            auVar270._12_4_ = auVar153._12_4_ * auVar78._12_4_;
            auVar110 = ZEXT416((uint)(1.0 / (auVar103._0_4_ - auVar332._0_4_)));
            auVar78 = vshufpd_avx(auVar81,auVar81,3);
            auVar221 = vshufpd_avx(auVar202,auVar202,3);
            auVar153 = vshufpd_avx(auVar243,auVar243,3);
            auVar121 = vshufpd_avx(auVar284,auVar284,3);
            auVar78 = vsubps_avx(auVar78,auVar81);
            auVar109 = vsubps_avx(auVar221,auVar202);
            auVar139 = vsubps_avx(auVar153,auVar243);
            auVar121 = vsubps_avx(auVar121,auVar284);
            auVar221 = vminps_avx(auVar78,auVar109);
            auVar78 = vmaxps_avx(auVar78,auVar109);
            auVar153 = vminps_avx(auVar139,auVar121);
            auVar153 = vminps_avx(auVar221,auVar153);
            auVar221 = vmaxps_avx(auVar139,auVar121);
            auVar78 = vmaxps_avx(auVar78,auVar221);
            auVar221 = vshufps_avx(auVar110,auVar110,0);
            auVar319._0_4_ = auVar221._0_4_ * auVar153._0_4_;
            auVar319._4_4_ = auVar221._4_4_ * auVar153._4_4_;
            auVar319._8_4_ = auVar221._8_4_ * auVar153._8_4_;
            auVar319._12_4_ = auVar221._12_4_ * auVar153._12_4_;
            auVar326._0_4_ = auVar221._0_4_ * auVar78._0_4_;
            auVar326._4_4_ = auVar221._4_4_ * auVar78._4_4_;
            auVar326._8_4_ = auVar221._8_4_ * auVar78._8_4_;
            auVar326._12_4_ = auVar221._12_4_ * auVar78._12_4_;
            auVar78 = vmovsldup_avx(auVar332);
            auVar285._4_12_ = auVar78._4_12_;
            auVar285._0_4_ = fVar230;
            auVar296._4_12_ = auVar332._4_12_;
            auVar296._0_4_ = fVar217;
            auVar162._0_4_ = (fVar230 + fVar217) * 0.5;
            auVar162._4_4_ = (auVar78._4_4_ + auVar332._4_4_) * 0.5;
            auVar162._8_4_ = (auVar78._8_4_ + auVar332._8_4_) * 0.5;
            auVar162._12_4_ = (auVar78._12_4_ + auVar332._12_4_) * 0.5;
            auVar78 = vshufps_avx(auVar162,auVar162,0);
            fVar211 = auVar78._0_4_;
            fVar231 = auVar78._4_4_;
            fVar212 = auVar78._8_4_;
            fVar232 = auVar78._12_4_;
            local_548 = auVar4._0_4_;
            fStack_544 = auVar4._4_4_;
            fStack_540 = auVar4._8_4_;
            fStack_53c = auVar4._12_4_;
            auVar111._0_4_ = fVar211 * (float)local_288._0_4_ + local_548;
            auVar111._4_4_ = fVar231 * (float)local_288._4_4_ + fStack_544;
            auVar111._8_4_ = fVar212 * fStack_280 + fStack_540;
            auVar111._12_4_ = fVar232 * fStack_27c + fStack_53c;
            local_5c8._0_4_ = auVar293._0_4_;
            local_5c8._4_4_ = auVar293._4_4_;
            fStack_5c0 = auVar293._8_4_;
            fStack_5bc = auVar293._12_4_;
            auVar143._0_4_ = fVar211 * (float)local_298._0_4_ + (float)local_5c8._0_4_;
            auVar143._4_4_ = fVar231 * (float)local_298._4_4_ + (float)local_5c8._4_4_;
            auVar143._8_4_ = fVar212 * fStack_290 + fStack_5c0;
            auVar143._12_4_ = fVar232 * fStack_28c + fStack_5bc;
            local_5d8._0_4_ = auVar5._0_4_;
            local_5d8._4_4_ = auVar5._4_4_;
            fStack_5d0 = auVar5._8_4_;
            fStack_5cc = auVar5._12_4_;
            auVar203._0_4_ = fVar211 * (float)local_2a8._0_4_ + (float)local_5d8._0_4_;
            auVar203._4_4_ = fVar231 * (float)local_2a8._4_4_ + (float)local_5d8._4_4_;
            auVar203._8_4_ = fVar212 * fStack_2a0 + fStack_5d0;
            auVar203._12_4_ = fVar232 * fStack_29c + fStack_5cc;
            auVar78 = vsubps_avx(auVar143,auVar111);
            auVar112._0_4_ = auVar111._0_4_ + fVar211 * auVar78._0_4_;
            auVar112._4_4_ = auVar111._4_4_ + fVar231 * auVar78._4_4_;
            auVar112._8_4_ = auVar111._8_4_ + fVar212 * auVar78._8_4_;
            auVar112._12_4_ = auVar111._12_4_ + fVar232 * auVar78._12_4_;
            auVar78 = vsubps_avx(auVar203,auVar143);
            auVar144._0_4_ = auVar143._0_4_ + fVar211 * auVar78._0_4_;
            auVar144._4_4_ = auVar143._4_4_ + fVar231 * auVar78._4_4_;
            auVar144._8_4_ = auVar143._8_4_ + fVar212 * auVar78._8_4_;
            auVar144._12_4_ = auVar143._12_4_ + fVar232 * auVar78._12_4_;
            auVar78 = vsubps_avx(auVar144,auVar112);
            fVar211 = auVar112._0_4_ + fVar211 * auVar78._0_4_;
            fVar231 = auVar112._4_4_ + fVar231 * auVar78._4_4_;
            auVar82._0_8_ = CONCAT44(fVar231,fVar211);
            auVar82._8_4_ = auVar112._8_4_ + fVar212 * auVar78._8_4_;
            auVar82._12_4_ = auVar112._12_4_ + fVar232 * auVar78._12_4_;
            fVar212 = auVar78._0_4_ * 3.0;
            fVar232 = auVar78._4_4_ * 3.0;
            auVar113._0_8_ = CONCAT44(fVar232,fVar212);
            auVar113._8_4_ = auVar78._8_4_ * 3.0;
            auVar113._12_4_ = auVar78._12_4_ * 3.0;
            auVar145._8_8_ = auVar82._0_8_;
            auVar145._0_8_ = auVar82._0_8_;
            auVar78 = vshufpd_avx(auVar82,auVar82,3);
            auVar221 = vshufps_avx(auVar162,auVar162,0x55);
            auVar139 = vsubps_avx(auVar78,auVar145);
            auVar305._0_4_ = auVar139._0_4_ * auVar221._0_4_ + fVar211;
            auVar305._4_4_ = auVar139._4_4_ * auVar221._4_4_ + fVar231;
            auVar305._8_4_ = auVar139._8_4_ * auVar221._8_4_ + fVar211;
            auVar305._12_4_ = auVar139._12_4_ * auVar221._12_4_ + fVar231;
            auVar146._8_8_ = auVar113._0_8_;
            auVar146._0_8_ = auVar113._0_8_;
            auVar78 = vshufpd_avx(auVar113,auVar113,1);
            auVar78 = vsubps_avx(auVar78,auVar146);
            auVar114._0_4_ = auVar78._0_4_ * auVar221._0_4_ + fVar212;
            auVar114._4_4_ = auVar78._4_4_ * auVar221._4_4_ + fVar232;
            auVar114._8_4_ = auVar78._8_4_ * auVar221._8_4_ + fVar212;
            auVar114._12_4_ = auVar78._12_4_ * auVar221._12_4_ + fVar232;
            auVar221 = vmovshdup_avx(auVar114);
            auVar204._0_8_ = auVar221._0_8_ ^ 0x8000000080000000;
            auVar204._8_4_ = auVar221._8_4_ ^ 0x80000000;
            auVar204._12_4_ = auVar221._12_4_ ^ 0x80000000;
            auVar153 = vmovshdup_avx(auVar139);
            auVar78 = vunpcklps_avx(auVar153,auVar204);
            auVar121 = vshufps_avx(auVar78,auVar204,4);
            auVar83._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
            auVar83._8_4_ = -auVar139._8_4_;
            auVar83._12_4_ = -auVar139._12_4_;
            auVar78 = vmovlhps_avx(auVar83,auVar114);
            auVar109 = vshufps_avx(auVar78,auVar114,8);
            auVar78 = ZEXT416((uint)(auVar114._0_4_ * auVar153._0_4_ -
                                    auVar139._0_4_ * auVar221._0_4_));
            auVar221 = vshufps_avx(auVar78,auVar78,0);
            auVar78 = vdivps_avx(auVar121,auVar221);
            auVar221 = vdivps_avx(auVar109,auVar221);
            auVar109 = vinsertps_avx(auVar257,auVar319,0x1c);
            auVar139 = vinsertps_avx(auVar270,auVar326,0x1c);
            auVar110 = vinsertps_avx(auVar319,auVar257,0x4c);
            auVar234 = vinsertps_avx(auVar326,auVar270,0x4c);
            auVar153 = vmovsldup_avx(auVar78);
            auVar147._0_4_ = auVar153._0_4_ * auVar109._0_4_;
            auVar147._4_4_ = auVar153._4_4_ * auVar109._4_4_;
            auVar147._8_4_ = auVar153._8_4_ * auVar109._8_4_;
            auVar147._12_4_ = auVar153._12_4_ * auVar109._12_4_;
            auVar115._0_4_ = auVar139._0_4_ * auVar153._0_4_;
            auVar115._4_4_ = auVar139._4_4_ * auVar153._4_4_;
            auVar115._8_4_ = auVar139._8_4_ * auVar153._8_4_;
            auVar115._12_4_ = auVar139._12_4_ * auVar153._12_4_;
            auVar121 = vminps_avx(auVar147,auVar115);
            auVar153 = vmaxps_avx(auVar115,auVar147);
            auVar72 = vmovsldup_avx(auVar221);
            auVar327._0_4_ = auVar110._0_4_ * auVar72._0_4_;
            auVar327._4_4_ = auVar110._4_4_ * auVar72._4_4_;
            auVar327._8_4_ = auVar110._8_4_ * auVar72._8_4_;
            auVar327._12_4_ = auVar110._12_4_ * auVar72._12_4_;
            auVar148._0_4_ = auVar234._0_4_ * auVar72._0_4_;
            auVar148._4_4_ = auVar234._4_4_ * auVar72._4_4_;
            auVar148._8_4_ = auVar234._8_4_ * auVar72._8_4_;
            auVar148._12_4_ = auVar234._12_4_ * auVar72._12_4_;
            auVar72 = vminps_avx(auVar327,auVar148);
            auVar177._0_4_ = auVar121._0_4_ + auVar72._0_4_;
            auVar177._4_4_ = auVar121._4_4_ + auVar72._4_4_;
            auVar177._8_4_ = auVar121._8_4_ + auVar72._8_4_;
            auVar177._12_4_ = auVar121._12_4_ + auVar72._12_4_;
            auVar121 = vmaxps_avx(auVar148,auVar327);
            auVar72 = vsubps_avx(auVar285,auVar162);
            auVar104 = vsubps_avx(auVar296,auVar162);
            auVar116._0_4_ = auVar153._0_4_ + auVar121._0_4_;
            auVar116._4_4_ = auVar153._4_4_ + auVar121._4_4_;
            auVar116._8_4_ = auVar153._8_4_ + auVar121._8_4_;
            auVar116._12_4_ = auVar153._12_4_ + auVar121._12_4_;
            auVar149._8_8_ = 0x3f800000;
            auVar149._0_8_ = 0x3f800000;
            auVar153 = vsubps_avx(auVar149,auVar116);
            auVar121 = vsubps_avx(auVar149,auVar177);
            fVar214 = auVar72._0_4_;
            auVar178._0_4_ = fVar214 * auVar153._0_4_;
            fVar235 = auVar72._4_4_;
            auVar178._4_4_ = fVar235 * auVar153._4_4_;
            fVar191 = auVar72._8_4_;
            auVar178._8_4_ = fVar191 * auVar153._8_4_;
            fVar100 = auVar72._12_4_;
            auVar178._12_4_ = fVar100 * auVar153._12_4_;
            fVar212 = auVar104._0_4_;
            auVar117._0_4_ = fVar212 * auVar153._0_4_;
            fVar232 = auVar104._4_4_;
            auVar117._4_4_ = fVar232 * auVar153._4_4_;
            fVar213 = auVar104._8_4_;
            auVar117._8_4_ = fVar213 * auVar153._8_4_;
            fVar233 = auVar104._12_4_;
            auVar117._12_4_ = fVar233 * auVar153._12_4_;
            auVar297._0_4_ = fVar214 * auVar121._0_4_;
            auVar297._4_4_ = fVar235 * auVar121._4_4_;
            auVar297._8_4_ = fVar191 * auVar121._8_4_;
            auVar297._12_4_ = fVar100 * auVar121._12_4_;
            auVar150._0_4_ = fVar212 * auVar121._0_4_;
            auVar150._4_4_ = fVar232 * auVar121._4_4_;
            auVar150._8_4_ = fVar213 * auVar121._8_4_;
            auVar150._12_4_ = fVar233 * auVar121._12_4_;
            auVar153 = vminps_avx(auVar178,auVar297);
            auVar121 = vminps_avx(auVar117,auVar150);
            auVar72 = vminps_avx(auVar153,auVar121);
            auVar153 = vmaxps_avx(auVar297,auVar178);
            auVar121 = vmaxps_avx(auVar150,auVar117);
            auVar104 = vshufps_avx(auVar162,auVar162,0x54);
            auVar121 = vmaxps_avx(auVar121,auVar153);
            auVar133 = vshufps_avx(auVar305,auVar305,0);
            auVar159 = vshufps_avx(auVar305,auVar305,0x55);
            auVar153 = vhaddps_avx(auVar72,auVar72);
            auVar121 = vhaddps_avx(auVar121,auVar121);
            auVar163._0_4_ = auVar133._0_4_ * auVar78._0_4_ + auVar159._0_4_ * auVar221._0_4_;
            auVar163._4_4_ = auVar133._4_4_ * auVar78._4_4_ + auVar159._4_4_ * auVar221._4_4_;
            auVar163._8_4_ = auVar133._8_4_ * auVar78._8_4_ + auVar159._8_4_ * auVar221._8_4_;
            auVar163._12_4_ = auVar133._12_4_ * auVar78._12_4_ + auVar159._12_4_ * auVar221._12_4_;
            auVar72 = vsubps_avx(auVar104,auVar163);
            fVar211 = auVar72._0_4_ + auVar153._0_4_;
            fVar231 = auVar72._0_4_ + auVar121._0_4_;
            auVar153 = vmaxss_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar211));
            auVar121 = vminss_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar217));
            if (auVar153._0_4_ <= auVar121._0_4_) {
              auVar153 = vmovshdup_avx(auVar78);
              auVar84._0_4_ = auVar153._0_4_ * auVar109._0_4_;
              auVar84._4_4_ = auVar153._4_4_ * auVar109._4_4_;
              auVar84._8_4_ = auVar153._8_4_ * auVar109._8_4_;
              auVar84._12_4_ = auVar153._12_4_ * auVar109._12_4_;
              auVar118._0_4_ = auVar139._0_4_ * auVar153._0_4_;
              auVar118._4_4_ = auVar139._4_4_ * auVar153._4_4_;
              auVar118._8_4_ = auVar139._8_4_ * auVar153._8_4_;
              auVar118._12_4_ = auVar139._12_4_ * auVar153._12_4_;
              auVar121 = vminps_avx(auVar84,auVar118);
              auVar153 = vmaxps_avx(auVar118,auVar84);
              auVar109 = vmovshdup_avx(auVar221);
              auVar179._0_4_ = auVar110._0_4_ * auVar109._0_4_;
              auVar179._4_4_ = auVar110._4_4_ * auVar109._4_4_;
              auVar179._8_4_ = auVar110._8_4_ * auVar109._8_4_;
              auVar179._12_4_ = auVar110._12_4_ * auVar109._12_4_;
              auVar119._0_4_ = auVar234._0_4_ * auVar109._0_4_;
              auVar119._4_4_ = auVar234._4_4_ * auVar109._4_4_;
              auVar119._8_4_ = auVar234._8_4_ * auVar109._8_4_;
              auVar119._12_4_ = auVar234._12_4_ * auVar109._12_4_;
              auVar109 = vminps_avx(auVar179,auVar119);
              auVar151._0_4_ = auVar121._0_4_ + auVar109._0_4_;
              auVar151._4_4_ = auVar121._4_4_ + auVar109._4_4_;
              auVar151._8_4_ = auVar121._8_4_ + auVar109._8_4_;
              auVar151._12_4_ = auVar121._12_4_ + auVar109._12_4_;
              auVar121 = vmaxps_avx(auVar119,auVar179);
              auVar85._0_4_ = auVar153._0_4_ + auVar121._0_4_;
              auVar85._4_4_ = auVar153._4_4_ + auVar121._4_4_;
              auVar85._8_4_ = auVar153._8_4_ + auVar121._8_4_;
              auVar85._12_4_ = auVar153._12_4_ + auVar121._12_4_;
              auVar153 = vsubps_avx(auVar225,auVar85);
              auVar121 = vsubps_avx(auVar225,auVar151);
              auVar152._0_4_ = fVar214 * auVar153._0_4_;
              auVar152._4_4_ = fVar235 * auVar153._4_4_;
              auVar152._8_4_ = fVar191 * auVar153._8_4_;
              auVar152._12_4_ = fVar100 * auVar153._12_4_;
              auVar180._0_4_ = fVar214 * auVar121._0_4_;
              auVar180._4_4_ = fVar235 * auVar121._4_4_;
              auVar180._8_4_ = fVar191 * auVar121._8_4_;
              auVar180._12_4_ = fVar100 * auVar121._12_4_;
              auVar86._0_4_ = fVar212 * auVar153._0_4_;
              auVar86._4_4_ = fVar232 * auVar153._4_4_;
              auVar86._8_4_ = fVar213 * auVar153._8_4_;
              auVar86._12_4_ = fVar233 * auVar153._12_4_;
              auVar120._0_4_ = fVar212 * auVar121._0_4_;
              auVar120._4_4_ = fVar232 * auVar121._4_4_;
              auVar120._8_4_ = fVar213 * auVar121._8_4_;
              auVar120._12_4_ = fVar233 * auVar121._12_4_;
              auVar153 = vminps_avx(auVar152,auVar180);
              auVar121 = vminps_avx(auVar86,auVar120);
              auVar153 = vminps_avx(auVar153,auVar121);
              auVar121 = vmaxps_avx(auVar180,auVar152);
              auVar109 = vmaxps_avx(auVar120,auVar86);
              auVar153 = vhaddps_avx(auVar153,auVar153);
              auVar121 = vmaxps_avx(auVar109,auVar121);
              auVar121 = vhaddps_avx(auVar121,auVar121);
              auVar109 = vmovshdup_avx(auVar72);
              auVar139 = ZEXT416((uint)(auVar109._0_4_ + auVar153._0_4_));
              auVar153 = vmaxss_avx(auVar332,auVar139);
              auVar109 = ZEXT416((uint)(auVar109._0_4_ + auVar121._0_4_));
              auVar121 = vminss_avx(auVar109,auVar103);
              if (auVar153._0_4_ <= auVar121._0_4_) {
                bVar66 = 0;
                if ((fVar230 < fVar211) && (fVar231 < fVar217)) {
                  auVar153 = vcmpps_avx(auVar109,auVar103,1);
                  auVar121 = vcmpps_avx(auVar332,auVar139,1);
                  auVar153 = vandps_avx(auVar121,auVar153);
                  bVar66 = auVar153[0];
                }
                auVar302 = ZEXT1664(auVar332);
                if ((uVar67 < 4 && 0.001 <= fVar210) && (bVar66 & 1) == 0) goto LAB_01037914;
                lVar70 = 200;
                do {
                  fVar210 = auVar72._0_4_;
                  fVar217 = 1.0 - fVar210;
                  auVar153 = ZEXT416((uint)(fVar217 * fVar217 * fVar217));
                  auVar153 = vshufps_avx(auVar153,auVar153,0);
                  auVar121 = ZEXT416((uint)(fVar210 * 3.0 * fVar217 * fVar217));
                  auVar121 = vshufps_avx(auVar121,auVar121,0);
                  auVar109 = ZEXT416((uint)(fVar217 * fVar210 * fVar210 * 3.0));
                  auVar109 = vshufps_avx(auVar109,auVar109,0);
                  auVar139 = ZEXT416((uint)(fVar210 * fVar210 * fVar210));
                  auVar139 = vshufps_avx(auVar139,auVar139,0);
                  local_578._0_4_ = auVar6._0_4_;
                  local_578._4_4_ = auVar6._4_4_;
                  fStack_570 = auVar6._8_4_;
                  fStack_56c = auVar6._12_4_;
                  fVar217 = auVar153._0_4_ * local_548 +
                            auVar121._0_4_ * (float)local_5c8._0_4_ +
                            auVar139._0_4_ * (float)local_578._0_4_ +
                            auVar109._0_4_ * (float)local_5d8._0_4_;
                  fVar210 = auVar153._4_4_ * fStack_544 +
                            auVar121._4_4_ * (float)local_5c8._4_4_ +
                            auVar139._4_4_ * (float)local_578._4_4_ +
                            auVar109._4_4_ * (float)local_5d8._4_4_;
                  auVar87._0_8_ = CONCAT44(fVar210,fVar217);
                  auVar87._8_4_ =
                       auVar153._8_4_ * fStack_540 +
                       auVar121._8_4_ * fStack_5c0 +
                       auVar139._8_4_ * fStack_570 + auVar109._8_4_ * fStack_5d0;
                  auVar87._12_4_ =
                       auVar153._12_4_ * fStack_53c +
                       auVar121._12_4_ * fStack_5bc +
                       auVar139._12_4_ * fStack_56c + auVar109._12_4_ * fStack_5cc;
                  auVar122._8_8_ = auVar87._0_8_;
                  auVar122._0_8_ = auVar87._0_8_;
                  auVar121 = vshufpd_avx(auVar87,auVar87,1);
                  auVar153 = vmovshdup_avx(auVar72);
                  auVar121 = vsubps_avx(auVar121,auVar122);
                  auVar88._0_4_ = auVar153._0_4_ * auVar121._0_4_ + fVar217;
                  auVar88._4_4_ = auVar153._4_4_ * auVar121._4_4_ + fVar210;
                  auVar88._8_4_ = auVar153._8_4_ * auVar121._8_4_ + fVar217;
                  auVar88._12_4_ = auVar153._12_4_ * auVar121._12_4_ + fVar210;
                  auVar153 = vshufps_avx(auVar88,auVar88,0);
                  auVar121 = vshufps_avx(auVar88,auVar88,0x55);
                  auVar123._0_4_ = auVar78._0_4_ * auVar153._0_4_ + auVar221._0_4_ * auVar121._0_4_;
                  auVar123._4_4_ = auVar78._4_4_ * auVar153._4_4_ + auVar221._4_4_ * auVar121._4_4_;
                  auVar123._8_4_ = auVar78._8_4_ * auVar153._8_4_ + auVar221._8_4_ * auVar121._8_4_;
                  auVar123._12_4_ =
                       auVar78._12_4_ * auVar153._12_4_ + auVar221._12_4_ * auVar121._12_4_;
                  auVar72 = vsubps_avx(auVar72,auVar123);
                  auVar124._8_4_ = 0x7fffffff;
                  auVar124._0_8_ = 0x7fffffff7fffffff;
                  auVar124._12_4_ = 0x7fffffff;
                  auVar153 = vandps_avx(auVar88,auVar124);
                  auVar121 = vshufps_avx(auVar153,auVar153,0xf5);
                  auVar153 = vmaxss_avx(auVar121,auVar153);
                  if (auVar153._0_4_ < (float)local_278._0_4_) {
                    fVar217 = auVar72._0_4_;
                    if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
                      auVar78 = vmovshdup_avx(auVar72);
                      fVar210 = auVar78._0_4_;
                      if ((0.0 <= fVar210) && (fVar210 <= 1.0)) {
                        auVar78 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar234 = vinsertps_avx(auVar78,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar78 = vdpps_avx(auVar234,local_2b8,0x7f);
                        auVar221 = vdpps_avx(auVar234,local_2c8,0x7f);
                        auVar153 = vdpps_avx(auVar234,local_2d8,0x7f);
                        auVar121 = vdpps_avx(auVar234,local_2e8,0x7f);
                        auVar109 = vdpps_avx(auVar234,local_2f8,0x7f);
                        auVar139 = vdpps_avx(auVar234,local_308,0x7f);
                        auVar110 = vdpps_avx(auVar234,local_318,0x7f);
                        auVar234 = vdpps_avx(auVar234,local_328,0x7f);
                        fVar232 = 1.0 - fVar210;
                        fVar213 = 1.0 - fVar217;
                        fVar230 = auVar72._4_4_;
                        fVar211 = auVar72._8_4_;
                        fVar231 = auVar72._12_4_;
                        fVar212 = fVar213 * fVar217 * fVar217 * 3.0;
                        auVar244._0_4_ = fVar217 * fVar217 * fVar217;
                        auVar244._4_4_ = fVar230 * fVar230 * fVar230;
                        auVar244._8_4_ = fVar211 * fVar211 * fVar211;
                        auVar244._12_4_ = fVar231 * fVar231 * fVar231;
                        fVar211 = fVar213 * fVar213 * fVar217 * 3.0;
                        fVar231 = fVar213 * fVar213 * fVar213;
                        fVar230 = fVar231 * (fVar232 * auVar78._0_4_ + fVar210 * auVar109._0_4_) +
                                  (fVar232 * auVar221._0_4_ + auVar139._0_4_ * fVar210) * fVar211 +
                                  fVar212 * (auVar110._0_4_ * fVar210 + fVar232 * auVar153._0_4_) +
                                  auVar244._0_4_ *
                                  (fVar232 * auVar121._0_4_ + fVar210 * auVar234._0_4_);
                        auVar78 = ZEXT416((uint)fVar230);
                        if (((fVar192 <= fVar230) &&
                            (fVar232 = *(float *)(ray + k * 4 + 0x80), fVar230 <= fVar232)) &&
                           (pGVar9 = (context->scene->geometries).items[uVar64].ptr,
                           (pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1c8 = vshufps_avx(auVar72,auVar72,0x55);
                          auVar271._8_4_ = 0x3f800000;
                          auVar271._0_8_ = 0x3f8000003f800000;
                          auVar271._12_4_ = 0x3f800000;
                          auVar221 = vsubps_avx(auVar271,local_1c8);
                          fVar233 = local_1c8._0_4_;
                          fVar214 = local_1c8._4_4_;
                          fVar235 = local_1c8._8_4_;
                          fVar191 = local_1c8._12_4_;
                          fVar100 = auVar221._0_4_;
                          fVar101 = auVar221._4_4_;
                          fVar102 = auVar221._8_4_;
                          fVar169 = auVar221._12_4_;
                          auVar286._0_4_ =
                               fVar233 * (float)local_3f8._0_4_ + fVar100 * (float)local_3e8._0_4_;
                          auVar286._4_4_ =
                               fVar214 * (float)local_3f8._4_4_ + fVar101 * (float)local_3e8._4_4_;
                          auVar286._8_4_ = fVar235 * fStack_3f0 + fVar102 * fStack_3e0;
                          auVar286._12_4_ = fVar191 * fStack_3ec + fVar169 * fStack_3dc;
                          auVar298._0_4_ =
                               fVar233 * (float)local_438._0_4_ + fVar100 * (float)local_418._0_4_;
                          auVar298._4_4_ =
                               fVar214 * (float)local_438._4_4_ + fVar101 * (float)local_418._4_4_;
                          auVar298._8_4_ = fVar235 * fStack_430 + fVar102 * fStack_410;
                          auVar298._12_4_ = fVar191 * fStack_42c + fVar169 * fStack_40c;
                          auVar306._0_4_ =
                               fVar233 * (float)local_348._0_4_ + fVar100 * (float)local_428._0_4_;
                          auVar306._4_4_ =
                               fVar214 * (float)local_348._4_4_ + fVar101 * (float)local_428._4_4_;
                          auVar306._8_4_ = fVar235 * fStack_340 + fVar102 * fStack_420;
                          auVar306._12_4_ = fVar191 * fStack_33c + fVar169 * fStack_41c;
                          auVar272._0_4_ = fVar233 * fVar215 + fVar100 * (float)local_408._0_4_;
                          auVar272._4_4_ = fVar214 * fVar236 + fVar101 * (float)local_408._4_4_;
                          auVar272._8_4_ = fVar235 * fVar170 + fVar102 * fStack_400;
                          auVar272._12_4_ = fVar191 * fVar186 + fVar169 * fStack_3fc;
                          auVar109 = vsubps_avx(auVar298,auVar286);
                          auVar139 = vsubps_avx(auVar306,auVar298);
                          auVar110 = vsubps_avx(auVar272,auVar306);
                          local_1d8 = vshufps_avx(auVar72,auVar72,0);
                          fVar191 = local_1d8._0_4_;
                          fVar100 = local_1d8._4_4_;
                          fVar101 = local_1d8._8_4_;
                          fVar102 = local_1d8._12_4_;
                          auVar221 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                          fVar213 = auVar221._0_4_;
                          fVar233 = auVar221._4_4_;
                          fVar214 = auVar221._8_4_;
                          fVar235 = auVar221._12_4_;
                          auVar221 = vshufps_avx(auVar244,auVar244,0);
                          auVar153 = vshufps_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),0);
                          auVar121 = vshufps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),0);
                          auVar226._0_4_ =
                               (fVar213 * (fVar213 * auVar109._0_4_ + fVar191 * auVar139._0_4_) +
                               fVar191 * (fVar213 * auVar139._0_4_ + fVar191 * auVar110._0_4_)) *
                               3.0;
                          auVar226._4_4_ =
                               (fVar233 * (fVar233 * auVar109._4_4_ + fVar100 * auVar139._4_4_) +
                               fVar100 * (fVar233 * auVar139._4_4_ + fVar100 * auVar110._4_4_)) *
                               3.0;
                          auVar226._8_4_ =
                               (fVar214 * (fVar214 * auVar109._8_4_ + fVar101 * auVar139._8_4_) +
                               fVar101 * (fVar214 * auVar139._8_4_ + fVar101 * auVar110._8_4_)) *
                               3.0;
                          auVar226._12_4_ =
                               (fVar235 * (fVar235 * auVar109._12_4_ + fVar102 * auVar139._12_4_) +
                               fVar102 * (fVar235 * auVar139._12_4_ + fVar102 * auVar110._12_4_)) *
                               3.0;
                          auVar109 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
                          auVar181._0_4_ =
                               auVar109._0_4_ * (float)local_358._0_4_ +
                               auVar121._0_4_ * (float)local_368._0_4_ +
                               auVar221._0_4_ * (float)local_388._0_4_ +
                               auVar153._0_4_ * (float)local_378._0_4_;
                          auVar181._4_4_ =
                               auVar109._4_4_ * (float)local_358._4_4_ +
                               auVar121._4_4_ * (float)local_368._4_4_ +
                               auVar221._4_4_ * (float)local_388._4_4_ +
                               auVar153._4_4_ * (float)local_378._4_4_;
                          auVar181._8_4_ =
                               auVar109._8_4_ * fStack_350 +
                               auVar121._8_4_ * fStack_360 +
                               auVar221._8_4_ * fStack_380 + auVar153._8_4_ * fStack_370;
                          auVar181._12_4_ =
                               auVar109._12_4_ * fStack_34c +
                               auVar121._12_4_ * fStack_35c +
                               auVar221._12_4_ * fStack_37c + auVar153._12_4_ * fStack_36c;
                          auVar221 = vshufps_avx(auVar226,auVar226,0xc9);
                          auVar205._0_4_ = auVar181._0_4_ * auVar221._0_4_;
                          auVar205._4_4_ = auVar181._4_4_ * auVar221._4_4_;
                          auVar205._8_4_ = auVar181._8_4_ * auVar221._8_4_;
                          auVar205._12_4_ = auVar181._12_4_ * auVar221._12_4_;
                          auVar221 = vshufps_avx(auVar181,auVar181,0xc9);
                          auVar182._0_4_ = auVar226._0_4_ * auVar221._0_4_;
                          auVar182._4_4_ = auVar226._4_4_ * auVar221._4_4_;
                          auVar182._8_4_ = auVar226._8_4_ * auVar221._8_4_;
                          auVar182._12_4_ = auVar226._12_4_ * auVar221._12_4_;
                          auVar221 = vsubps_avx(auVar182,auVar205);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar230;
                            uVar2 = vextractps_avx(auVar221,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar221,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(int *)(ray + k * 4 + 0xe0) = auVar221._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar217;
                            *(float *)(ray + k * 4 + 0x100) = fVar210;
                            *(uint *)(ray + k * 4 + 0x110) = uVar8;
                            *(uint *)(ray + k * 4 + 0x120) = uVar64;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar153 = vshufps_avx(auVar221,auVar221,0x55);
                            auVar121 = vshufps_avx(auVar221,auVar221,0xaa);
                            local_1e8 = vshufps_avx(auVar221,auVar221,0);
                            local_208[0] = (RTCHitN)auVar153[0];
                            local_208[1] = (RTCHitN)auVar153[1];
                            local_208[2] = (RTCHitN)auVar153[2];
                            local_208[3] = (RTCHitN)auVar153[3];
                            local_208[4] = (RTCHitN)auVar153[4];
                            local_208[5] = (RTCHitN)auVar153[5];
                            local_208[6] = (RTCHitN)auVar153[6];
                            local_208[7] = (RTCHitN)auVar153[7];
                            local_208[8] = (RTCHitN)auVar153[8];
                            local_208[9] = (RTCHitN)auVar153[9];
                            local_208[10] = (RTCHitN)auVar153[10];
                            local_208[0xb] = (RTCHitN)auVar153[0xb];
                            local_208[0xc] = (RTCHitN)auVar153[0xc];
                            local_208[0xd] = (RTCHitN)auVar153[0xd];
                            local_208[0xe] = (RTCHitN)auVar153[0xe];
                            local_208[0xf] = (RTCHitN)auVar153[0xf];
                            local_1f8 = auVar121;
                            local_1b8 = local_3a8._0_8_;
                            uStack_1b0 = local_3a8._8_8_;
                            local_1a8 = local_398._0_8_;
                            uStack_1a0 = local_398._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_194 = context->user->instID[0];
                            local_198 = uStack_194;
                            uStack_190 = uStack_194;
                            uStack_18c = uStack_194;
                            uStack_188 = context->user->instPrimID[0];
                            uStack_184 = uStack_188;
                            uStack_180 = uStack_188;
                            uStack_17c = uStack_188;
                            *(float *)(ray + k * 4 + 0x80) = fVar230;
                            local_4a8 = *local_490;
                            local_468.valid = (int *)local_4a8;
                            local_468.geometryUserPtr = pGVar9->userPtr;
                            local_468.context = context->user;
                            local_468.hit = local_208;
                            local_468.N = 4;
                            local_468.ray = (RTCRayN *)ray;
                            if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar9->intersectionFilterN)(&local_468);
                              auVar302._8_56_ = extraout_var;
                              auVar302._0_8_ = extraout_XMM1_Qa;
                              auVar78 = auVar302._0_16_;
                            }
                            if (local_4a8 == (undefined1  [16])0x0) {
                              auVar221 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar78 = vpcmpeqd_avx(auVar78,auVar78);
                              auVar221 = auVar221 ^ auVar78;
                            }
                            else {
                              p_Var10 = context->args->filter;
                              auVar78 = vpcmpeqd_avx(auVar121,auVar121);
                              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var10)(&local_468);
                                auVar78 = vpcmpeqd_avx(auVar78,auVar78);
                              }
                              auVar153 = vpcmpeqd_avx(local_4a8,_DAT_01f7aa10);
                              auVar221 = auVar153 ^ auVar78;
                              if (local_4a8 != (undefined1  [16])0x0) {
                                auVar153 = auVar153 ^ auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   local_468.hit);
                                *(undefined1 (*) [16])(local_468.ray + 0xc0) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x10));
                                *(undefined1 (*) [16])(local_468.ray + 0xd0) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x20));
                                *(undefined1 (*) [16])(local_468.ray + 0xe0) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x30));
                                *(undefined1 (*) [16])(local_468.ray + 0xf0) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x40));
                                *(undefined1 (*) [16])(local_468.ray + 0x100) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x50));
                                *(undefined1 (*) [16])(local_468.ray + 0x110) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x60));
                                *(undefined1 (*) [16])(local_468.ray + 0x120) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x70));
                                *(undefined1 (*) [16])(local_468.ray + 0x130) = auVar78;
                                auVar78 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x80));
                                *(undefined1 (*) [16])(local_468.ray + 0x140) = auVar78;
                              }
                            }
                            auVar89._8_8_ = 0x100000001;
                            auVar89._0_8_ = 0x100000001;
                            if ((auVar89 & auVar221) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar232;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar70 = lVar70 + -1;
                } while (lVar70 != 0);
              }
            }
          }
        }
        if (uVar67 == 0) break;
      } while( true );
    }
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar99._4_4_ = uVar2;
    auVar99._0_4_ = uVar2;
    auVar99._8_4_ = uVar2;
    auVar99._12_4_ = uVar2;
    auVar99._16_4_ = uVar2;
    auVar99._20_4_ = uVar2;
    auVar99._24_4_ = uVar2;
    auVar99._28_4_ = uVar2;
    auVar90 = vcmpps_avx(local_178,auVar99,2);
    uVar64 = vmovmskps_avx(auVar90);
    uVar64 = (uint)uVar71 & uVar64;
    if (uVar64 == 0) {
      return;
    }
  } while( true );
LAB_01037914:
  auVar78 = vinsertps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar217),0x10);
  auVar308 = ZEXT1664(auVar78);
  goto LAB_010361ca;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }